

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  undefined4 uVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  ulong uVar33;
  undefined8 uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  byte bVar84;
  ulong uVar85;
  uint uVar86;
  uint uVar87;
  long lVar88;
  long lVar89;
  Geometry *pGVar90;
  undefined8 unaff_R13;
  ulong uVar91;
  ulong uVar92;
  long lVar93;
  size_t sVar94;
  byte bVar95;
  float fVar96;
  float fVar97;
  float fVar154;
  float fVar156;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar109 [16];
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar160;
  float fVar161;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined4 uVar162;
  float fVar176;
  float fVar177;
  vint4 bi_2;
  undefined1 auVar163 [16];
  float fVar178;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  vint4 bi_1;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  float fVar182;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar188;
  float fVar189;
  float fVar206;
  vint4 ai_2;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  vint4 bi;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  vint4 ai;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [64];
  vint4 ai_1;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [64];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  RTCFilterFunctionNArguments local_840;
  undefined1 local_810 [16];
  size_t local_7f8;
  undefined1 (*local_7f0) [32];
  long local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined4 uStack_710;
  undefined4 uStack_70c;
  undefined4 uStack_708;
  undefined4 uStack_704;
  undefined1 local_700 [64];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined4 uStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined4 local_540;
  int local_53c;
  undefined1 local_530 [16];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar85 = (ulong)(byte)prim[1];
  fVar182 = *(float *)(prim + uVar85 * 0x19 + 0x12);
  auVar103 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar103 = vinsertps_avx(auVar103,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar102 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar103 = vsubps_avx(auVar103,*(undefined1 (*) [16])(prim + uVar85 * 0x19 + 6));
  auVar190._0_4_ = fVar182 * auVar103._0_4_;
  auVar190._4_4_ = fVar182 * auVar103._4_4_;
  auVar190._8_4_ = fVar182 * auVar103._8_4_;
  auVar190._12_4_ = fVar182 * auVar103._12_4_;
  auVar163._0_4_ = fVar182 * auVar102._0_4_;
  auVar163._4_4_ = fVar182 * auVar102._4_4_;
  auVar163._8_4_ = fVar182 * auVar102._8_4_;
  auVar163._12_4_ = fVar182 * auVar102._12_4_;
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 4 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 5 + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 6 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar165 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xb + 6)));
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xc + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xd + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x12 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x13 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x14 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar233._4_4_ = auVar163._0_4_;
  auVar233._0_4_ = auVar163._0_4_;
  auVar233._8_4_ = auVar163._0_4_;
  auVar233._12_4_ = auVar163._0_4_;
  auVar108 = vshufps_avx(auVar163,auVar163,0x55);
  auVar101 = vshufps_avx(auVar163,auVar163,0xaa);
  fVar182 = auVar101._0_4_;
  auVar207._0_4_ = fVar182 * auVar98._0_4_;
  fVar176 = auVar101._4_4_;
  auVar207._4_4_ = fVar176 * auVar98._4_4_;
  fVar177 = auVar101._8_4_;
  auVar207._8_4_ = fVar177 * auVar98._8_4_;
  fVar178 = auVar101._12_4_;
  auVar207._12_4_ = fVar178 * auVar98._12_4_;
  auVar106._0_4_ = auVar99._0_4_ * fVar182;
  auVar106._4_4_ = auVar99._4_4_ * fVar176;
  auVar106._8_4_ = auVar99._8_4_ * fVar177;
  auVar106._12_4_ = auVar99._12_4_ * fVar178;
  auVar164._0_4_ = auVar100._0_4_ * fVar182;
  auVar164._4_4_ = auVar100._4_4_ * fVar176;
  auVar164._8_4_ = auVar100._8_4_ * fVar177;
  auVar164._12_4_ = auVar100._12_4_ * fVar178;
  auVar101 = vfmadd231ps_fma(auVar207,auVar108,auVar102);
  auVar107 = vfmadd231ps_fma(auVar106,auVar108,auVar27);
  auVar108 = vfmadd231ps_fma(auVar164,auVar29,auVar108);
  auVar104 = vfmadd231ps_fma(auVar101,auVar233,auVar103);
  auVar107 = vfmadd231ps_fma(auVar107,auVar233,auVar165);
  auVar163 = vfmadd231ps_fma(auVar108,auVar28,auVar233);
  auVar234._4_4_ = auVar190._0_4_;
  auVar234._0_4_ = auVar190._0_4_;
  auVar234._8_4_ = auVar190._0_4_;
  auVar234._12_4_ = auVar190._0_4_;
  auVar108 = vshufps_avx(auVar190,auVar190,0x55);
  auVar101 = vshufps_avx(auVar190,auVar190,0xaa);
  auVar98 = vmulps_avx512vl(auVar101,auVar98);
  auVar191._0_4_ = auVar101._0_4_ * auVar99._0_4_;
  auVar191._4_4_ = auVar101._4_4_ * auVar99._4_4_;
  auVar191._8_4_ = auVar101._8_4_ * auVar99._8_4_;
  auVar191._12_4_ = auVar101._12_4_ * auVar99._12_4_;
  auVar109._0_4_ = auVar101._0_4_ * auVar100._0_4_;
  auVar109._4_4_ = auVar101._4_4_ * auVar100._4_4_;
  auVar109._8_4_ = auVar101._8_4_ * auVar100._8_4_;
  auVar109._12_4_ = auVar101._12_4_ * auVar100._12_4_;
  auVar99 = vfmadd231ps_avx512vl(auVar98,auVar108,auVar102);
  auVar102 = vfmadd231ps_fma(auVar191,auVar108,auVar27);
  auVar98 = vfmadd231ps_fma(auVar109,auVar108,auVar29);
  auVar100 = vfmadd231ps_avx512vl(auVar99,auVar234,auVar103);
  auVar99 = vfmadd231ps_fma(auVar102,auVar234,auVar165);
  auVar223._8_4_ = 0x7fffffff;
  auVar223._0_8_ = 0x7fffffff7fffffff;
  auVar223._12_4_ = 0x7fffffff;
  auVar29 = vfmadd231ps_fma(auVar98,auVar234,auVar28);
  auVar103 = vandps_avx(auVar104,auVar223);
  auVar220._8_4_ = 0x219392ef;
  auVar220._0_8_ = 0x219392ef219392ef;
  auVar220._12_4_ = 0x219392ef;
  uVar91 = vcmpps_avx512vl(auVar103,auVar220,1);
  bVar13 = (bool)((byte)uVar91 & 1);
  auVar101._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar104._0_4_;
  bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar104._4_4_;
  bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar104._8_4_;
  bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar104._12_4_;
  auVar103 = vandps_avx(auVar107,auVar223);
  uVar91 = vcmpps_avx512vl(auVar103,auVar220,1);
  bVar13 = (bool)((byte)uVar91 & 1);
  auVar104._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar107._0_4_;
  bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar107._4_4_;
  bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar107._8_4_;
  bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar107._12_4_;
  auVar103 = vandps_avx(auVar163,auVar223);
  uVar91 = vcmpps_avx512vl(auVar103,auVar220,1);
  bVar13 = (bool)((byte)uVar91 & 1);
  auVar107._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar163._0_4_;
  bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
  auVar107._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar163._4_4_;
  bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
  auVar107._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar163._8_4_;
  bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
  auVar107._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar163._12_4_;
  auVar102 = vrcp14ps_avx512vl(auVar101);
  auVar221._8_4_ = 0x3f800000;
  auVar221._0_8_ = 0x3f8000003f800000;
  auVar221._12_4_ = 0x3f800000;
  auVar103 = vfnmadd213ps_fma(auVar101,auVar102,auVar221);
  auVar98 = vfmadd132ps_fma(auVar103,auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar104);
  auVar103 = vfnmadd213ps_fma(auVar104,auVar102,auVar221);
  auVar27 = vfmadd132ps_fma(auVar103,auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar107);
  auVar103 = vfnmadd213ps_fma(auVar107,auVar102,auVar221);
  auVar28 = vfmadd132ps_fma(auVar103,auVar102,auVar102);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar85 * 7 + 6);
  auVar103 = vpmovsxwd_avx(auVar103);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx512vl(auVar103,auVar100);
  auVar214._0_4_ = auVar98._0_4_ * auVar103._0_4_;
  auVar214._4_4_ = auVar98._4_4_ * auVar103._4_4_;
  auVar214._8_4_ = auVar98._8_4_ * auVar103._8_4_;
  auVar214._12_4_ = auVar98._12_4_ * auVar103._12_4_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar85 * 9 + 6);
  auVar103 = vpmovsxwd_avx(auVar102);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx512vl(auVar103,auVar100);
  auVar208._0_4_ = auVar98._0_4_ * auVar103._0_4_;
  auVar208._4_4_ = auVar98._4_4_ * auVar103._4_4_;
  auVar208._8_4_ = auVar98._8_4_ * auVar103._8_4_;
  auVar208._12_4_ = auVar98._12_4_ * auVar103._12_4_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar85 * 0xe + 6);
  auVar103 = vpmovsxwd_avx(auVar98);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar99);
  auVar222._0_4_ = auVar27._0_4_ * auVar103._0_4_;
  auVar222._4_4_ = auVar27._4_4_ * auVar103._4_4_;
  auVar222._8_4_ = auVar27._8_4_ * auVar103._8_4_;
  auVar222._12_4_ = auVar27._12_4_ * auVar103._12_4_;
  auVar98 = vpbroadcastd_avx512vl();
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar103 = vpmovsxwd_avx(auVar165);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar99);
  auVar179._0_4_ = auVar27._0_4_ * auVar103._0_4_;
  auVar179._4_4_ = auVar27._4_4_ * auVar103._4_4_;
  auVar179._8_4_ = auVar27._8_4_ * auVar103._8_4_;
  auVar179._12_4_ = auVar27._12_4_ * auVar103._12_4_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar85 * 0x15 + 6);
  auVar103 = vpmovsxwd_avx(auVar27);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar29);
  auVar192._0_4_ = auVar28._0_4_ * auVar103._0_4_;
  auVar192._4_4_ = auVar28._4_4_ * auVar103._4_4_;
  auVar192._8_4_ = auVar28._8_4_ * auVar103._8_4_;
  auVar192._12_4_ = auVar28._12_4_ * auVar103._12_4_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar85 * 0x17 + 6);
  auVar103 = vpmovsxwd_avx(auVar99);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar29);
  auVar105._0_4_ = auVar28._0_4_ * auVar103._0_4_;
  auVar105._4_4_ = auVar28._4_4_ * auVar103._4_4_;
  auVar105._8_4_ = auVar28._8_4_ * auVar103._8_4_;
  auVar105._12_4_ = auVar28._12_4_ * auVar103._12_4_;
  auVar103 = vpminsd_avx(auVar214,auVar208);
  auVar102 = vpminsd_avx(auVar222,auVar179);
  auVar103 = vmaxps_avx(auVar103,auVar102);
  auVar102 = vpminsd_avx(auVar192,auVar105);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar28._4_4_ = uVar162;
  auVar28._0_4_ = uVar162;
  auVar28._8_4_ = uVar162;
  auVar28._12_4_ = uVar162;
  auVar102 = vmaxps_avx512vl(auVar102,auVar28);
  auVar103 = vmaxps_avx(auVar103,auVar102);
  auVar29._8_4_ = 0x3f7ffffa;
  auVar29._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar29._12_4_ = 0x3f7ffffa;
  local_470 = vmulps_avx512vl(auVar103,auVar29);
  auVar103 = vpmaxsd_avx(auVar214,auVar208);
  auVar102 = vpmaxsd_avx(auVar222,auVar179);
  auVar103 = vminps_avx(auVar103,auVar102);
  auVar102 = vpmaxsd_avx(auVar192,auVar105);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar100._4_4_ = uVar162;
  auVar100._0_4_ = uVar162;
  auVar100._8_4_ = uVar162;
  auVar100._12_4_ = uVar162;
  auVar102 = vminps_avx512vl(auVar102,auVar100);
  auVar103 = vminps_avx(auVar103,auVar102);
  auVar108._8_4_ = 0x3f800003;
  auVar108._0_8_ = 0x3f8000033f800003;
  auVar108._12_4_ = 0x3f800003;
  auVar103 = vmulps_avx512vl(auVar103,auVar108);
  uVar30 = vcmpps_avx512vl(local_470,auVar103,2);
  uVar34 = vpcmpgtd_avx512vl(auVar98,_DAT_01f4ad30);
  uVar91 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar30 & 0xf & (byte)uVar34));
  local_7f0 = (undefined1 (*) [32])local_100;
  auVar175 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar175);
  sVar94 = k;
  local_7f8 = k;
  do {
    auVar122 = local_7a0;
    if (uVar91 == 0) {
      return;
    }
    lVar88 = 0;
    for (uVar85 = uVar91; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
      lVar88 = lVar88 + 1;
    }
    uVar8 = *(uint *)(prim + 2);
    uVar9 = *(uint *)(prim + lVar88 * 4 + 6);
    pGVar90 = (context->scene->geometries).items[uVar8].ptr;
    uVar85 = (ulong)*(uint *)(*(long *)&pGVar90->field_0x58 +
                             pGVar90[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)uVar9);
    p_Var12 = pGVar90[1].intersectionFilterN;
    lVar88 = *(long *)&pGVar90[1].time_range.upper;
    auVar103 = *(undefined1 (*) [16])(lVar88 + (long)p_Var12 * uVar85);
    pauVar3 = (undefined1 (*) [16])(lVar88 + (uVar85 + 1) * (long)p_Var12);
    uVar30 = *(undefined8 *)*pauVar3;
    uVar34 = *(undefined8 *)(*pauVar3 + 8);
    auVar100 = *pauVar3;
    auVar28 = *pauVar3;
    auVar27 = *pauVar3;
    auVar102 = *pauVar3;
    pauVar4 = (undefined1 (*) [16])(lVar88 + (uVar85 + 2) * (long)p_Var12);
    uVar77 = *(undefined8 *)*pauVar4;
    uVar78 = *(undefined8 *)(*pauVar4 + 8);
    auVar29 = *pauVar4;
    auVar99 = *pauVar4;
    auVar165 = *pauVar4;
    auVar98 = *pauVar4;
    uVar91 = uVar91 - 1 & uVar91;
    pauVar5 = (undefined1 (*) [12])(lVar88 + (uVar85 + 3) * (long)p_Var12);
    uVar79 = *(undefined8 *)*pauVar5;
    uVar80 = *(undefined8 *)(*pauVar5 + 8);
    local_8a0 = (float)uVar79;
    fStack_89c = (float)((ulong)uVar79 >> 0x20);
    fStack_898 = (float)uVar80;
    fStack_894 = (float)((ulong)uVar80 >> 0x20);
    if (uVar91 != 0) {
      uVar92 = uVar91 - 1 & uVar91;
      for (uVar85 = uVar91; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
      }
      if (uVar92 != 0) {
        for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar10 = (int)pGVar90[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar108 = vinsertps_avx(ZEXT416(*(uint *)(ray + sVar94 * 4)),
                             ZEXT416(*(uint *)(ray + sVar94 * 4 + 0x40)),0x1c);
    auVar108 = vinsertps_avx(auVar108,ZEXT416(*(uint *)(ray + sVar94 * 4 + 0x80)),0x28);
    auVar107 = vsubps_avx(auVar103,auVar108);
    uVar162 = auVar107._0_4_;
    auVar183._4_4_ = uVar162;
    auVar183._0_4_ = uVar162;
    auVar183._8_4_ = uVar162;
    auVar183._12_4_ = uVar162;
    auVar101 = vshufps_avx(auVar107,auVar107,0x55);
    aVar6 = pre->ray_space[k].vx.field_0;
    aVar7 = pre->ray_space[k].vy.field_0;
    auVar107 = vshufps_avx(auVar107,auVar107,0xaa);
    fVar182 = pre->ray_space[k].vz.field_0.m128[0];
    fVar176 = pre->ray_space[k].vz.field_0.m128[1];
    fVar177 = pre->ray_space[k].vz.field_0.m128[2];
    fVar178 = pre->ray_space[k].vz.field_0.m128[3];
    auVar226._0_4_ = fVar182 * auVar107._0_4_;
    auVar226._4_4_ = fVar176 * auVar107._4_4_;
    auVar226._8_4_ = fVar177 * auVar107._8_4_;
    auVar226._12_4_ = fVar178 * auVar107._12_4_;
    auVar101 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar7,auVar101);
    auVar163 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar6,auVar183);
    auVar101 = vshufps_avx(auVar103,auVar103,0xff);
    auVar104 = vsubps_avx512vl(auVar102,auVar108);
    uVar162 = auVar104._0_4_;
    auVar193._4_4_ = uVar162;
    auVar193._0_4_ = uVar162;
    auVar193._8_4_ = uVar162;
    auVar193._12_4_ = uVar162;
    auVar107 = vshufps_avx(auVar104,auVar104,0x55);
    auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
    auVar227._0_4_ = fVar182 * auVar104._0_4_;
    auVar227._4_4_ = fVar176 * auVar104._4_4_;
    auVar227._8_4_ = fVar177 * auVar104._8_4_;
    auVar227._12_4_ = fVar178 * auVar104._12_4_;
    auVar107 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar7,auVar107);
    auVar164 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar6,auVar193);
    auVar105 = vshufps_avx512vl(auVar102,auVar102,0xff);
    auVar104 = vsubps_avx512vl(auVar98,auVar108);
    uVar162 = auVar104._0_4_;
    auVar224._4_4_ = uVar162;
    auVar224._0_4_ = uVar162;
    auVar224._8_4_ = uVar162;
    auVar224._12_4_ = uVar162;
    auVar107 = vshufps_avx(auVar104,auVar104,0x55);
    auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
    auVar230._0_4_ = fVar182 * auVar104._0_4_;
    auVar230._4_4_ = fVar176 * auVar104._4_4_;
    auVar230._8_4_ = fVar177 * auVar104._8_4_;
    auVar230._12_4_ = fVar178 * auVar104._12_4_;
    auVar107 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar7,auVar107);
    auVar104 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar6,auVar224);
    auVar106 = vshufps_avx512vl(auVar98,auVar98,0xff);
    auVar81._12_4_ = fStack_894;
    auVar81._0_12_ = *pauVar5;
    auVar107 = vsubps_avx512vl(auVar81,auVar108);
    uVar162 = auVar107._0_4_;
    auVar194._4_4_ = uVar162;
    auVar194._0_4_ = uVar162;
    auVar194._8_4_ = uVar162;
    auVar194._12_4_ = uVar162;
    auVar108 = vshufps_avx(auVar107,auVar107,0x55);
    auVar107 = vshufps_avx(auVar107,auVar107,0xaa);
    auVar235._0_4_ = fVar182 * auVar107._0_4_;
    auVar235._4_4_ = fVar176 * auVar107._4_4_;
    auVar235._8_4_ = fVar177 * auVar107._8_4_;
    auVar235._12_4_ = fVar178 * auVar107._12_4_;
    auVar108 = vfmadd231ps_fma(auVar235,(undefined1  [16])aVar7,auVar108);
    auVar107 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar6,auVar194);
    auVar108 = vshufps_avx512vl(auVar81,auVar81,0xff);
    lVar88 = (long)iVar10;
    lVar93 = lVar88 * 0x44;
    auVar126 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar93);
    uVar162 = auVar163._0_4_;
    local_5c0._4_4_ = uVar162;
    local_5c0._0_4_ = uVar162;
    local_5c0._8_4_ = uVar162;
    local_5c0._12_4_ = uVar162;
    local_5c0._16_4_ = uVar162;
    local_5c0._20_4_ = uVar162;
    local_5c0._24_4_ = uVar162;
    local_5c0._28_4_ = uVar162;
    auVar110._8_4_ = 1;
    auVar110._0_8_ = 0x100000001;
    auVar110._12_4_ = 1;
    auVar110._16_4_ = 1;
    auVar110._20_4_ = 1;
    auVar110._24_4_ = 1;
    auVar110._28_4_ = 1;
    local_5e0 = vpermps_avx2(auVar110,ZEXT1632(auVar163));
    local_3a0 = vbroadcastsd_avx512vl(auVar101);
    auVar127 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar93 + 0x484);
    uVar162 = auVar164._0_4_;
    auVar180._4_4_ = uVar162;
    auVar180._0_4_ = uVar162;
    auVar180._8_4_ = uVar162;
    auVar180._12_4_ = uVar162;
    local_600._16_4_ = uVar162;
    local_600._0_16_ = auVar180;
    local_600._20_4_ = uVar162;
    local_600._24_4_ = uVar162;
    local_600._28_4_ = uVar162;
    local_620 = vpermps_avx512vl(auVar110,ZEXT1632(auVar164));
    local_3c0 = vbroadcastsd_avx512vl(auVar105);
    auVar125 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar93 + 0x908);
    uVar162 = auVar104._0_4_;
    local_640._4_4_ = uVar162;
    local_640._0_4_ = uVar162;
    local_640._8_4_ = uVar162;
    local_640._12_4_ = uVar162;
    local_640._16_4_ = uVar162;
    local_640._20_4_ = uVar162;
    local_640._24_4_ = uVar162;
    local_640._28_4_ = uVar162;
    local_660 = vpermps_avx512vl(auVar110,ZEXT1632(auVar104));
    local_3e0 = vbroadcastsd_avx512vl(auVar106);
    auVar124 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar93 + 0xd8c);
    fVar176 = auVar107._0_4_;
    local_680._4_4_ = fVar176;
    local_680._0_4_ = fVar176;
    fStack_678 = fVar176;
    fStack_674 = fVar176;
    fStack_670 = fVar176;
    fStack_66c = fVar176;
    fStack_668 = fVar176;
    register0x0000139c = fVar176;
    _local_6a0 = vpermps_avx512vl(auVar110,ZEXT1632(auVar107));
    local_400 = vbroadcastsd_avx512vl(auVar108);
    auVar110 = vmulps_avx512vl(_local_680,auVar124);
    auVar111 = vmulps_avx512vl(_local_6a0,auVar124);
    auVar108 = vfmadd231ps_fma(auVar110,auVar125,local_640);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar125,local_660);
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar127,local_600);
    auVar112 = vfmadd231ps_avx512vl(auVar110,auVar127,local_620);
    auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar108),auVar126,local_5c0);
    auVar219 = ZEXT3264(auVar113);
    auVar110 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar93);
    auVar111 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar93 + 0x484);
    auVar123 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar93 + 0x908);
    auVar114 = vfmadd231ps_avx512vl(auVar112,auVar126,local_5e0);
    auVar213 = ZEXT3264(auVar114);
    auVar112 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar93 + 0xd8c);
    auVar115 = vmulps_avx512vl(_local_680,auVar112);
    auVar116 = vmulps_avx512vl(_local_6a0,auVar112);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar123,local_640);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar123,local_660);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar111,local_600);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar111,local_620);
    auVar101 = vfmadd231ps_fma(auVar115,auVar110,local_5c0);
    auVar225 = ZEXT1664(auVar101);
    auVar105 = vfmadd231ps_fma(auVar116,auVar110,local_5e0);
    auVar115 = vsubps_avx512vl(ZEXT1632(auVar101),auVar113);
    auVar116 = vsubps_avx512vl(ZEXT1632(auVar105),auVar114);
    auVar117 = vmulps_avx512vl(auVar114,auVar115);
    auVar118 = vmulps_avx512vl(auVar113,auVar116);
    auVar117 = vsubps_avx512vl(auVar117,auVar118);
    auVar118 = vmulps_avx512vl(local_400,auVar124);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar125,local_3e0);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar127,local_3c0);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar126,local_3a0);
    auVar119 = vmulps_avx512vl(local_400,auVar112);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar123,local_3e0);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar111,local_3c0);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar110,local_3a0);
    auVar120 = vmulps_avx512vl(auVar116,auVar116);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar115,auVar115);
    auVar121 = vmaxps_avx512vl(auVar118,auVar119);
    auVar121 = vmulps_avx512vl(auVar121,auVar121);
    auVar120 = vmulps_avx512vl(auVar121,auVar120);
    auVar117 = vmulps_avx512vl(auVar117,auVar117);
    uVar31 = vcmpps_avx512vl(auVar117,auVar120,2);
    auVar108 = vblendps_avx(auVar163,auVar103,8);
    auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar108 = vandps_avx512vl(auVar108,auVar106);
    auVar102 = vblendps_avx(auVar164,auVar102,8);
    auVar102 = vandps_avx512vl(auVar102,auVar106);
    auVar108 = vmaxps_avx(auVar108,auVar102);
    auVar102 = vblendps_avx(auVar104,auVar98,8);
    auVar98 = vandps_avx512vl(auVar102,auVar106);
    auVar102 = vblendps_avx(auVar107,auVar81,8);
    auVar102 = vandps_avx512vl(auVar102,auVar106);
    auVar102 = vmaxps_avx(auVar98,auVar102);
    auVar102 = vmaxps_avx(auVar108,auVar102);
    auVar98 = vmovshdup_avx(auVar102);
    auVar98 = vmaxss_avx(auVar98,auVar102);
    auVar102 = vshufpd_avx(auVar102,auVar102,1);
    auVar102 = vmaxss_avx(auVar102,auVar98);
    auVar120._0_4_ = (float)iVar10;
    local_7a0._4_12_ = auVar163._4_12_;
    local_7a0._0_4_ = auVar120._0_4_;
    local_7a0._16_16_ = auVar122._16_16_;
    auVar120._4_4_ = auVar120._0_4_;
    auVar120._8_4_ = auVar120._0_4_;
    auVar120._12_4_ = auVar120._0_4_;
    auVar120._16_4_ = auVar120._0_4_;
    auVar120._20_4_ = auVar120._0_4_;
    auVar120._24_4_ = auVar120._0_4_;
    auVar120._28_4_ = auVar120._0_4_;
    uVar32 = vcmpps_avx512vl(auVar120,_DAT_01f7b060,0xe);
    bVar95 = (byte)uVar31 & (byte)uVar32;
    fVar182 = auVar102._0_4_ * 4.7683716e-07;
    local_810 = ZEXT416((uint)fVar182);
    auVar117._8_4_ = 2;
    auVar117._0_8_ = 0x200000002;
    auVar117._12_4_ = 2;
    auVar117._16_4_ = 2;
    auVar117._20_4_ = 2;
    auVar117._24_4_ = 2;
    auVar117._28_4_ = 2;
    local_760 = vpermps_avx512vl(auVar117,ZEXT1632(auVar163));
    auVar238 = ZEXT3264(local_760);
    local_780 = vpermps_avx512vl(auVar117,ZEXT1632(auVar164));
    auVar239 = ZEXT3264(local_780);
    auVar122 = vpermps_avx512vl(auVar117,ZEXT1632(auVar104));
    local_460 = vpermps_avx2(auVar117,ZEXT1632(auVar107));
    local_720 = *(undefined4 *)(ray + sVar94 * 4 + 0xc0);
    uStack_71c = 0;
    uStack_718 = 0;
    uStack_714 = 0;
    auVar175 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar175);
    auVar175 = vpbroadcastd_avx512f();
    local_340 = vmovdqa64_avx512f(auVar175);
    if (bVar95 != 0) {
      auVar112 = vmulps_avx512vl(local_460,auVar112);
      auVar123 = vfmadd213ps_avx512vl(auVar123,auVar122,auVar112);
      auVar111 = vfmadd213ps_avx512vl(auVar111,local_780,auVar123);
      auVar117 = vfmadd213ps_avx512vl(auVar110,local_760,auVar111);
      auVar124 = vmulps_avx512vl(local_460,auVar124);
      auVar125 = vfmadd213ps_avx512vl(auVar125,auVar122,auVar124);
      auVar111 = vfmadd213ps_avx512vl(auVar127,local_780,auVar125);
      auVar127 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar93 + 0x1210);
      auVar125 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar93 + 0x1694);
      auVar124 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar93 + 0x1b18);
      auVar110 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar93 + 0x1f9c);
      auVar121 = vfmadd213ps_avx512vl(auVar126,local_760,auVar111);
      auVar228._0_4_ = fVar176 * auVar110._0_4_;
      auVar228._4_4_ = fVar176 * auVar110._4_4_;
      auVar228._8_4_ = fVar176 * auVar110._8_4_;
      auVar228._12_4_ = fVar176 * auVar110._12_4_;
      auVar228._16_4_ = fVar176 * auVar110._16_4_;
      auVar228._20_4_ = fVar176 * auVar110._20_4_;
      auVar228._24_4_ = fVar176 * auVar110._24_4_;
      auVar228._28_4_ = 0;
      auVar126 = vmulps_avx512vl(_local_6a0,auVar110);
      auVar110 = vmulps_avx512vl(local_460,auVar110);
      auVar111 = vfmadd231ps_avx512vl(auVar228,auVar124,local_640);
      auVar126 = vfmadd231ps_avx512vl(auVar126,auVar124,local_660);
      auVar124 = vfmadd231ps_avx512vl(auVar110,auVar122,auVar124);
      auVar110 = vfmadd231ps_avx512vl(auVar111,auVar125,local_600);
      auVar126 = vfmadd231ps_avx512vl(auVar126,auVar125,local_620);
      auVar111 = vfmadd231ps_avx512vl(auVar124,local_780,auVar125);
      auVar102 = vfmadd231ps_fma(auVar110,auVar127,local_5c0);
      auVar110 = vfmadd231ps_avx512vl(auVar126,auVar127,local_5e0);
      auVar126 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar93 + 0x1210);
      auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar93 + 0x1b18);
      auVar124 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar93 + 0x1f9c);
      auVar123 = vfmadd231ps_avx512vl(auVar111,local_760,auVar127);
      auVar111._4_4_ = fVar176 * auVar124._4_4_;
      auVar111._0_4_ = fVar176 * auVar124._0_4_;
      auVar111._8_4_ = fVar176 * auVar124._8_4_;
      auVar111._12_4_ = fVar176 * auVar124._12_4_;
      auVar111._16_4_ = fVar176 * auVar124._16_4_;
      auVar111._20_4_ = fVar176 * auVar124._20_4_;
      auVar111._24_4_ = fVar176 * auVar124._24_4_;
      auVar111._28_4_ = auVar127._28_4_;
      auVar127 = vmulps_avx512vl(_local_6a0,auVar124);
      auVar124 = vmulps_avx512vl(local_460,auVar124);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar125,local_640);
      auVar112 = vfmadd231ps_avx512vl(auVar127,auVar125,local_660);
      auVar238 = ZEXT3264(local_760);
      auVar239 = ZEXT3264(local_780);
      auVar175 = ZEXT3264(auVar122);
      auVar125 = vfmadd231ps_avx512vl(auVar124,auVar122,auVar125);
      auVar127 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar93 + 0x1694);
      auVar124 = vfmadd231ps_avx512vl(auVar111,auVar127,local_600);
      auVar111 = vfmadd231ps_avx512vl(auVar112,auVar127,local_620);
      auVar127 = vfmadd231ps_avx512vl(auVar125,local_780,auVar127);
      auVar98 = vfmadd231ps_fma(auVar124,auVar126,local_5c0);
      auVar125 = vfmadd231ps_avx512vl(auVar111,auVar126,local_5e0);
      auVar124 = vfmadd231ps_avx512vl(auVar127,local_760,auVar126);
      auVar236._8_4_ = 0x7fffffff;
      auVar236._0_8_ = 0x7fffffff7fffffff;
      auVar236._12_4_ = 0x7fffffff;
      auVar236._16_4_ = 0x7fffffff;
      auVar236._20_4_ = 0x7fffffff;
      auVar236._24_4_ = 0x7fffffff;
      auVar236._28_4_ = 0x7fffffff;
      auVar126 = vandps_avx(ZEXT1632(auVar102),auVar236);
      auVar127 = vandps_avx(auVar110,auVar236);
      auVar127 = vmaxps_avx(auVar126,auVar127);
      auVar126 = vandps_avx(auVar123,auVar236);
      auVar126 = vmaxps_avx(auVar127,auVar126);
      auVar232._4_4_ = fVar182;
      auVar232._0_4_ = fVar182;
      auVar232._8_4_ = fVar182;
      auVar232._12_4_ = fVar182;
      auVar232._16_4_ = fVar182;
      auVar232._20_4_ = fVar182;
      auVar232._24_4_ = fVar182;
      auVar232._28_4_ = fVar182;
      uVar85 = vcmpps_avx512vl(auVar126,auVar232,1);
      bVar13 = (bool)((byte)uVar85 & 1);
      auVar128._0_4_ = (float)((uint)bVar13 * auVar115._0_4_ | (uint)!bVar13 * auVar102._0_4_);
      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar128._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar102._4_4_);
      bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar128._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar102._8_4_);
      bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar128._12_4_ = (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar102._12_4_);
      fVar177 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar115._16_4_);
      auVar128._16_4_ = fVar177;
      fVar176 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar115._20_4_);
      auVar128._20_4_ = fVar176;
      fVar178 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar115._24_4_);
      auVar128._24_4_ = fVar178;
      uVar86 = (uint)(byte)(uVar85 >> 7) * auVar115._28_4_;
      auVar128._28_4_ = uVar86;
      bVar13 = (bool)((byte)uVar85 & 1);
      auVar129._0_4_ = (float)((uint)bVar13 * auVar116._0_4_ | (uint)!bVar13 * auVar110._0_4_);
      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar129._4_4_ = (float)((uint)bVar13 * auVar116._4_4_ | (uint)!bVar13 * auVar110._4_4_);
      bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar129._8_4_ = (float)((uint)bVar13 * auVar116._8_4_ | (uint)!bVar13 * auVar110._8_4_);
      bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar129._12_4_ = (float)((uint)bVar13 * auVar116._12_4_ | (uint)!bVar13 * auVar110._12_4_);
      bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar129._16_4_ = (float)((uint)bVar13 * auVar116._16_4_ | (uint)!bVar13 * auVar110._16_4_);
      bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar129._20_4_ = (float)((uint)bVar13 * auVar116._20_4_ | (uint)!bVar13 * auVar110._20_4_);
      bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar129._24_4_ = (float)((uint)bVar13 * auVar116._24_4_ | (uint)!bVar13 * auVar110._24_4_);
      bVar13 = SUB81(uVar85 >> 7,0);
      auVar129._28_4_ = (uint)bVar13 * auVar116._28_4_ | (uint)!bVar13 * auVar110._28_4_;
      auVar126 = vandps_avx(auVar236,ZEXT1632(auVar98));
      auVar127 = vandps_avx(auVar125,auVar236);
      auVar127 = vmaxps_avx(auVar126,auVar127);
      auVar126 = vandps_avx(auVar124,auVar236);
      auVar126 = vmaxps_avx(auVar127,auVar126);
      uVar85 = vcmpps_avx512vl(auVar126,auVar232,1);
      bVar13 = (bool)((byte)uVar85 & 1);
      auVar130._0_4_ = (float)((uint)bVar13 * auVar115._0_4_ | (uint)!bVar13 * auVar98._0_4_);
      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar130._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar98._4_4_);
      bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar130._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar98._8_4_);
      bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar130._12_4_ = (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar98._12_4_);
      fVar189 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar115._16_4_);
      auVar130._16_4_ = fVar189;
      fVar188 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar115._20_4_);
      auVar130._20_4_ = fVar188;
      fVar206 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar115._24_4_);
      auVar130._24_4_ = fVar206;
      auVar130._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar115._28_4_;
      bVar13 = (bool)((byte)uVar85 & 1);
      auVar131._0_4_ = (float)((uint)bVar13 * auVar116._0_4_ | (uint)!bVar13 * auVar125._0_4_);
      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar131._4_4_ = (float)((uint)bVar13 * auVar116._4_4_ | (uint)!bVar13 * auVar125._4_4_);
      bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar131._8_4_ = (float)((uint)bVar13 * auVar116._8_4_ | (uint)!bVar13 * auVar125._8_4_);
      bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar131._12_4_ = (float)((uint)bVar13 * auVar116._12_4_ | (uint)!bVar13 * auVar125._12_4_);
      bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar131._16_4_ = (float)((uint)bVar13 * auVar116._16_4_ | (uint)!bVar13 * auVar125._16_4_);
      bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar131._20_4_ = (float)((uint)bVar13 * auVar116._20_4_ | (uint)!bVar13 * auVar125._20_4_);
      bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar131._24_4_ = (float)((uint)bVar13 * auVar116._24_4_ | (uint)!bVar13 * auVar125._24_4_);
      bVar13 = SUB81(uVar85 >> 7,0);
      auVar131._28_4_ = (uint)bVar13 * auVar116._28_4_ | (uint)!bVar13 * auVar125._28_4_;
      auVar109 = vxorps_avx512vl(auVar180,auVar180);
      auVar126 = vfmadd213ps_avx512vl(auVar128,auVar128,ZEXT1632(auVar109));
      auVar102 = vfmadd231ps_fma(auVar126,auVar129,auVar129);
      auVar125 = vrsqrt14ps_avx512vl(ZEXT1632(auVar102));
      fVar96 = auVar125._0_4_;
      fVar97 = auVar125._4_4_;
      fVar154 = auVar125._8_4_;
      fVar155 = auVar125._12_4_;
      fVar156 = auVar125._16_4_;
      fVar157 = auVar125._20_4_;
      fVar158 = auVar125._24_4_;
      auVar126._4_4_ = fVar97 * fVar97 * fVar97 * auVar102._4_4_ * -0.5;
      auVar126._0_4_ = fVar96 * fVar96 * fVar96 * auVar102._0_4_ * -0.5;
      auVar126._8_4_ = fVar154 * fVar154 * fVar154 * auVar102._8_4_ * -0.5;
      auVar126._12_4_ = fVar155 * fVar155 * fVar155 * auVar102._12_4_ * -0.5;
      auVar126._16_4_ = fVar156 * fVar156 * fVar156 * -0.0;
      auVar126._20_4_ = fVar157 * fVar157 * fVar157 * -0.0;
      auVar126._24_4_ = fVar158 * fVar158 * fVar158 * -0.0;
      auVar126._28_4_ = 0;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar126 = vfmadd231ps_avx512vl(auVar126,auVar110,auVar125);
      auVar127._4_4_ = auVar129._4_4_ * auVar126._4_4_;
      auVar127._0_4_ = auVar129._0_4_ * auVar126._0_4_;
      auVar127._8_4_ = auVar129._8_4_ * auVar126._8_4_;
      auVar127._12_4_ = auVar129._12_4_ * auVar126._12_4_;
      auVar127._16_4_ = auVar129._16_4_ * auVar126._16_4_;
      auVar127._20_4_ = auVar129._20_4_ * auVar126._20_4_;
      auVar127._24_4_ = auVar129._24_4_ * auVar126._24_4_;
      auVar127._28_4_ = auVar125._28_4_;
      auVar125._4_4_ = auVar126._4_4_ * -auVar128._4_4_;
      auVar125._0_4_ = auVar126._0_4_ * -auVar128._0_4_;
      auVar125._8_4_ = auVar126._8_4_ * -auVar128._8_4_;
      auVar125._12_4_ = auVar126._12_4_ * -auVar128._12_4_;
      auVar125._16_4_ = auVar126._16_4_ * -fVar177;
      auVar125._20_4_ = auVar126._20_4_ * -fVar176;
      auVar125._24_4_ = auVar126._24_4_ * -fVar178;
      auVar125._28_4_ = uVar86 ^ 0x80000000;
      auVar111 = vmulps_avx512vl(auVar126,ZEXT1632(auVar109));
      auVar115 = ZEXT1632(auVar109);
      auVar124 = vfmadd213ps_avx512vl(auVar130,auVar130,auVar115);
      auVar102 = vfmadd231ps_fma(auVar124,auVar131,auVar131);
      auVar112 = vrsqrt14ps_avx512vl(ZEXT1632(auVar102));
      fVar176 = auVar112._0_4_;
      fVar177 = auVar112._4_4_;
      fVar178 = auVar112._8_4_;
      fVar96 = auVar112._12_4_;
      fVar97 = auVar112._16_4_;
      fVar154 = auVar112._20_4_;
      fVar155 = auVar112._24_4_;
      auVar124._4_4_ = fVar177 * fVar177 * fVar177 * auVar102._4_4_ * -0.5;
      auVar124._0_4_ = fVar176 * fVar176 * fVar176 * auVar102._0_4_ * -0.5;
      auVar124._8_4_ = fVar178 * fVar178 * fVar178 * auVar102._8_4_ * -0.5;
      auVar124._12_4_ = fVar96 * fVar96 * fVar96 * auVar102._12_4_ * -0.5;
      auVar124._16_4_ = fVar97 * fVar97 * fVar97 * -0.0;
      auVar124._20_4_ = fVar154 * fVar154 * fVar154 * -0.0;
      auVar124._24_4_ = fVar155 * fVar155 * fVar155 * -0.0;
      auVar124._28_4_ = 0;
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar110,auVar112);
      auVar123._4_4_ = auVar131._4_4_ * auVar124._4_4_;
      auVar123._0_4_ = auVar131._0_4_ * auVar124._0_4_;
      auVar123._8_4_ = auVar131._8_4_ * auVar124._8_4_;
      auVar123._12_4_ = auVar131._12_4_ * auVar124._12_4_;
      auVar123._16_4_ = auVar131._16_4_ * auVar124._16_4_;
      auVar123._20_4_ = auVar131._20_4_ * auVar124._20_4_;
      auVar123._24_4_ = auVar131._24_4_ * auVar124._24_4_;
      auVar123._28_4_ = auVar112._28_4_;
      auVar112._4_4_ = -auVar130._4_4_ * auVar124._4_4_;
      auVar112._0_4_ = -auVar130._0_4_ * auVar124._0_4_;
      auVar112._8_4_ = -auVar130._8_4_ * auVar124._8_4_;
      auVar112._12_4_ = -auVar130._12_4_ * auVar124._12_4_;
      auVar112._16_4_ = -fVar189 * auVar124._16_4_;
      auVar112._20_4_ = -fVar188 * auVar124._20_4_;
      auVar112._24_4_ = -fVar206 * auVar124._24_4_;
      auVar112._28_4_ = auVar126._28_4_;
      auVar126 = vmulps_avx512vl(auVar124,auVar115);
      auVar102 = vfmadd213ps_fma(auVar127,auVar118,auVar113);
      auVar98 = vfmadd213ps_fma(auVar125,auVar118,auVar114);
      auVar124 = vfmadd213ps_avx512vl(auVar111,auVar118,auVar121);
      auVar110 = vfmadd213ps_avx512vl(auVar123,auVar119,ZEXT1632(auVar101));
      auVar163 = vfnmadd213ps_fma(auVar127,auVar118,auVar113);
      auVar108 = vfmadd213ps_fma(auVar112,auVar119,ZEXT1632(auVar105));
      auVar164 = vfnmadd213ps_fma(auVar125,auVar118,auVar114);
      auVar107 = vfmadd213ps_fma(auVar126,auVar119,auVar117);
      auVar127 = vfnmadd231ps_avx512vl(auVar121,auVar118,auVar111);
      auVar106 = vfnmadd213ps_fma(auVar123,auVar119,ZEXT1632(auVar101));
      auVar105 = vfnmadd213ps_fma(auVar112,auVar119,ZEXT1632(auVar105));
      auVar179 = vfnmadd231ps_fma(auVar117,auVar119,auVar126);
      auVar125 = vsubps_avx512vl(auVar110,ZEXT1632(auVar163));
      auVar126 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar164));
      auVar111 = vsubps_avx512vl(ZEXT1632(auVar107),auVar127);
      auVar123 = vmulps_avx512vl(auVar126,auVar127);
      auVar101 = vfmsub231ps_fma(auVar123,ZEXT1632(auVar164),auVar111);
      auVar113._4_4_ = auVar163._4_4_ * auVar111._4_4_;
      auVar113._0_4_ = auVar163._0_4_ * auVar111._0_4_;
      auVar113._8_4_ = auVar163._8_4_ * auVar111._8_4_;
      auVar113._12_4_ = auVar163._12_4_ * auVar111._12_4_;
      auVar113._16_4_ = auVar111._16_4_ * 0.0;
      auVar113._20_4_ = auVar111._20_4_ * 0.0;
      auVar113._24_4_ = auVar111._24_4_ * 0.0;
      auVar113._28_4_ = auVar111._28_4_;
      auVar111 = vfmsub231ps_avx512vl(auVar113,auVar127,auVar125);
      auVar114._4_4_ = auVar164._4_4_ * auVar125._4_4_;
      auVar114._0_4_ = auVar164._0_4_ * auVar125._0_4_;
      auVar114._8_4_ = auVar164._8_4_ * auVar125._8_4_;
      auVar114._12_4_ = auVar164._12_4_ * auVar125._12_4_;
      auVar114._16_4_ = auVar125._16_4_ * 0.0;
      auVar114._20_4_ = auVar125._20_4_ * 0.0;
      auVar114._24_4_ = auVar125._24_4_ * 0.0;
      auVar114._28_4_ = auVar125._28_4_;
      auVar104 = vfmsub231ps_fma(auVar114,ZEXT1632(auVar163),auVar126);
      auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar115,auVar111);
      auVar126 = vfmadd231ps_avx512vl(auVar126,auVar115,ZEXT1632(auVar101));
      auVar117 = ZEXT1632(auVar109);
      uVar85 = vcmpps_avx512vl(auVar126,auVar117,2);
      bVar84 = (byte)uVar85;
      fVar96 = (float)((uint)(bVar84 & 1) * auVar102._0_4_ |
                      (uint)!(bool)(bVar84 & 1) * auVar106._0_4_);
      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
      fVar154 = (float)((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar106._4_4_);
      bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
      fVar156 = (float)((uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar106._8_4_);
      bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
      fVar158 = (float)((uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar106._12_4_);
      auVar123 = ZEXT1632(CONCAT412(fVar158,CONCAT48(fVar156,CONCAT44(fVar154,fVar96))));
      fVar97 = (float)((uint)(bVar84 & 1) * auVar98._0_4_ |
                      (uint)!(bool)(bVar84 & 1) * auVar105._0_4_);
      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
      fVar155 = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar105._4_4_);
      bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
      fVar157 = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar105._8_4_);
      bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
      fVar159 = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar105._12_4_);
      auVar112 = ZEXT1632(CONCAT412(fVar159,CONCAT48(fVar157,CONCAT44(fVar155,fVar97))));
      auVar132._0_4_ =
           (float)((uint)(bVar84 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar179._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar132._4_4_ = (float)((uint)bVar13 * auVar124._4_4_ | (uint)!bVar13 * auVar179._4_4_);
      bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar132._8_4_ = (float)((uint)bVar13 * auVar124._8_4_ | (uint)!bVar13 * auVar179._8_4_);
      bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar132._12_4_ = (float)((uint)bVar13 * auVar124._12_4_ | (uint)!bVar13 * auVar179._12_4_);
      fVar176 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar124._16_4_);
      auVar132._16_4_ = fVar176;
      fVar177 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar124._20_4_);
      auVar132._20_4_ = fVar177;
      fVar178 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar124._24_4_);
      auVar132._24_4_ = fVar178;
      iVar1 = (uint)(byte)(uVar85 >> 7) * auVar124._28_4_;
      auVar132._28_4_ = iVar1;
      auVar125 = vblendmps_avx512vl(ZEXT1632(auVar163),auVar110);
      auVar133._0_4_ =
           (uint)(bVar84 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar98._0_4_;
      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar133._4_4_ = (uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar98._4_4_;
      bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar133._8_4_ = (uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar98._8_4_;
      bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar133._12_4_ = (uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar98._12_4_;
      auVar133._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * auVar125._16_4_;
      auVar133._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * auVar125._20_4_;
      auVar133._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * auVar125._24_4_;
      auVar133._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar125._28_4_;
      auVar125 = vblendmps_avx512vl(ZEXT1632(auVar164),ZEXT1632(auVar108));
      auVar134._0_4_ =
           (float)((uint)(bVar84 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar101._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar134._4_4_ = (float)((uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar101._4_4_);
      bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar134._8_4_ = (float)((uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar101._8_4_);
      bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar134._12_4_ = (float)((uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar101._12_4_);
      fVar206 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar125._16_4_);
      auVar134._16_4_ = fVar206;
      fVar189 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar125._20_4_);
      auVar134._20_4_ = fVar189;
      fVar188 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar125._24_4_);
      auVar134._24_4_ = fVar188;
      auVar134._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar125._28_4_;
      auVar125 = vblendmps_avx512vl(auVar127,ZEXT1632(auVar107));
      auVar135._0_4_ =
           (float)((uint)(bVar84 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar124._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar135._4_4_ = (float)((uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar124._4_4_);
      bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar135._8_4_ = (float)((uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar124._8_4_);
      bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar135._12_4_ = (float)((uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar124._12_4_);
      bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar135._16_4_ = (float)((uint)bVar13 * auVar125._16_4_ | (uint)!bVar13 * auVar124._16_4_);
      bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar135._20_4_ = (float)((uint)bVar13 * auVar125._20_4_ | (uint)!bVar13 * auVar124._20_4_);
      bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar135._24_4_ = (float)((uint)bVar13 * auVar125._24_4_ | (uint)!bVar13 * auVar124._24_4_);
      bVar13 = SUB81(uVar85 >> 7,0);
      auVar135._28_4_ = (uint)bVar13 * auVar125._28_4_ | (uint)!bVar13 * auVar124._28_4_;
      auVar136._0_4_ =
           (uint)(bVar84 & 1) * (int)auVar163._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar110._0_4_;
      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar136._4_4_ = (uint)bVar13 * (int)auVar163._4_4_ | (uint)!bVar13 * auVar110._4_4_;
      bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar136._8_4_ = (uint)bVar13 * (int)auVar163._8_4_ | (uint)!bVar13 * auVar110._8_4_;
      bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar136._12_4_ = (uint)bVar13 * (int)auVar163._12_4_ | (uint)!bVar13 * auVar110._12_4_;
      auVar136._16_4_ = (uint)!(bool)((byte)(uVar85 >> 4) & 1) * auVar110._16_4_;
      auVar136._20_4_ = (uint)!(bool)((byte)(uVar85 >> 5) & 1) * auVar110._20_4_;
      auVar136._24_4_ = (uint)!(bool)((byte)(uVar85 >> 6) & 1) * auVar110._24_4_;
      auVar136._28_4_ = (uint)!SUB81(uVar85 >> 7,0) * auVar110._28_4_;
      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar137._0_4_ =
           (uint)(bVar84 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar107._0_4_;
      bVar14 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar137._4_4_ = (uint)bVar14 * auVar127._4_4_ | (uint)!bVar14 * auVar107._4_4_;
      bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar137._8_4_ = (uint)bVar14 * auVar127._8_4_ | (uint)!bVar14 * auVar107._8_4_;
      bVar14 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar137._12_4_ = (uint)bVar14 * auVar127._12_4_ | (uint)!bVar14 * auVar107._12_4_;
      auVar137._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * auVar127._16_4_;
      auVar137._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * auVar127._20_4_;
      auVar137._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * auVar127._24_4_;
      iVar2 = (uint)(byte)(uVar85 >> 7) * auVar127._28_4_;
      auVar137._28_4_ = iVar2;
      auVar113 = vsubps_avx512vl(auVar136,auVar123);
      auVar127 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar164._12_4_ |
                                               (uint)!bVar16 * auVar108._12_4_,
                                               CONCAT48((uint)bVar15 * (int)auVar164._8_4_ |
                                                        (uint)!bVar15 * auVar108._8_4_,
                                                        CONCAT44((uint)bVar13 * (int)auVar164._4_4_
                                                                 | (uint)!bVar13 * auVar108._4_4_,
                                                                 (uint)(bVar84 & 1) *
                                                                 (int)auVar164._0_4_ |
                                                                 (uint)!(bool)(bVar84 & 1) *
                                                                 auVar108._0_4_)))),auVar112);
      auVar219 = ZEXT3264(auVar127);
      auVar125 = vsubps_avx(auVar137,auVar132);
      auVar124 = vsubps_avx(auVar123,auVar133);
      auVar225 = ZEXT3264(auVar124);
      auVar110 = vsubps_avx(auVar112,auVar134);
      auVar111 = vsubps_avx(auVar132,auVar135);
      auVar115._4_4_ = auVar125._4_4_ * fVar154;
      auVar115._0_4_ = auVar125._0_4_ * fVar96;
      auVar115._8_4_ = auVar125._8_4_ * fVar156;
      auVar115._12_4_ = auVar125._12_4_ * fVar158;
      auVar115._16_4_ = auVar125._16_4_ * 0.0;
      auVar115._20_4_ = auVar125._20_4_ * 0.0;
      auVar115._24_4_ = auVar125._24_4_ * 0.0;
      auVar115._28_4_ = iVar2;
      auVar102 = vfmsub231ps_fma(auVar115,auVar132,auVar113);
      auVar116._4_4_ = fVar155 * auVar113._4_4_;
      auVar116._0_4_ = fVar97 * auVar113._0_4_;
      auVar116._8_4_ = fVar157 * auVar113._8_4_;
      auVar116._12_4_ = fVar159 * auVar113._12_4_;
      auVar116._16_4_ = auVar113._16_4_ * 0.0;
      auVar116._20_4_ = auVar113._20_4_ * 0.0;
      auVar116._24_4_ = auVar113._24_4_ * 0.0;
      auVar116._28_4_ = auVar126._28_4_;
      auVar98 = vfmsub231ps_fma(auVar116,auVar123,auVar127);
      auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar117,ZEXT1632(auVar102));
      auVar209._0_4_ = auVar127._0_4_ * auVar132._0_4_;
      auVar209._4_4_ = auVar127._4_4_ * auVar132._4_4_;
      auVar209._8_4_ = auVar127._8_4_ * auVar132._8_4_;
      auVar209._12_4_ = auVar127._12_4_ * auVar132._12_4_;
      auVar209._16_4_ = auVar127._16_4_ * fVar176;
      auVar209._20_4_ = auVar127._20_4_ * fVar177;
      auVar209._24_4_ = auVar127._24_4_ * fVar178;
      auVar209._28_4_ = 0;
      auVar102 = vfmsub231ps_fma(auVar209,auVar112,auVar125);
      auVar114 = vfmadd231ps_avx512vl(auVar126,auVar117,ZEXT1632(auVar102));
      auVar126 = vmulps_avx512vl(auVar111,auVar133);
      auVar126 = vfmsub231ps_avx512vl(auVar126,auVar124,auVar135);
      auVar121._4_4_ = auVar110._4_4_ * auVar135._4_4_;
      auVar121._0_4_ = auVar110._0_4_ * auVar135._0_4_;
      auVar121._8_4_ = auVar110._8_4_ * auVar135._8_4_;
      auVar121._12_4_ = auVar110._12_4_ * auVar135._12_4_;
      auVar121._16_4_ = auVar110._16_4_ * auVar135._16_4_;
      auVar121._20_4_ = auVar110._20_4_ * auVar135._20_4_;
      auVar121._24_4_ = auVar110._24_4_ * auVar135._24_4_;
      auVar121._28_4_ = auVar135._28_4_;
      auVar102 = vfmsub231ps_fma(auVar121,auVar134,auVar111);
      auVar210._0_4_ = auVar134._0_4_ * auVar124._0_4_;
      auVar210._4_4_ = auVar134._4_4_ * auVar124._4_4_;
      auVar210._8_4_ = auVar134._8_4_ * auVar124._8_4_;
      auVar210._12_4_ = auVar134._12_4_ * auVar124._12_4_;
      auVar210._16_4_ = fVar206 * auVar124._16_4_;
      auVar210._20_4_ = fVar189 * auVar124._20_4_;
      auVar210._24_4_ = fVar188 * auVar124._24_4_;
      auVar210._28_4_ = 0;
      auVar98 = vfmsub231ps_fma(auVar210,auVar110,auVar133);
      auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar117,auVar126);
      auVar115 = vfmadd231ps_avx512vl(auVar126,auVar117,ZEXT1632(auVar102));
      auVar213 = ZEXT3264(auVar115);
      auVar126 = vmaxps_avx(auVar114,auVar115);
      uVar31 = vcmpps_avx512vl(auVar126,auVar117,2);
      bVar95 = bVar95 & (byte)uVar31;
      if (bVar95 != 0) {
        auVar42._4_4_ = auVar111._4_4_ * auVar127._4_4_;
        auVar42._0_4_ = auVar111._0_4_ * auVar127._0_4_;
        auVar42._8_4_ = auVar111._8_4_ * auVar127._8_4_;
        auVar42._12_4_ = auVar111._12_4_ * auVar127._12_4_;
        auVar42._16_4_ = auVar111._16_4_ * auVar127._16_4_;
        auVar42._20_4_ = auVar111._20_4_ * auVar127._20_4_;
        auVar42._24_4_ = auVar111._24_4_ * auVar127._24_4_;
        auVar42._28_4_ = auVar126._28_4_;
        auVar101 = vfmsub231ps_fma(auVar42,auVar110,auVar125);
        auVar43._4_4_ = auVar125._4_4_ * auVar124._4_4_;
        auVar43._0_4_ = auVar125._0_4_ * auVar124._0_4_;
        auVar43._8_4_ = auVar125._8_4_ * auVar124._8_4_;
        auVar43._12_4_ = auVar125._12_4_ * auVar124._12_4_;
        auVar43._16_4_ = auVar125._16_4_ * auVar124._16_4_;
        auVar43._20_4_ = auVar125._20_4_ * auVar124._20_4_;
        auVar43._24_4_ = auVar125._24_4_ * auVar124._24_4_;
        auVar43._28_4_ = auVar125._28_4_;
        auVar108 = vfmsub231ps_fma(auVar43,auVar113,auVar111);
        auVar44._4_4_ = auVar110._4_4_ * auVar113._4_4_;
        auVar44._0_4_ = auVar110._0_4_ * auVar113._0_4_;
        auVar44._8_4_ = auVar110._8_4_ * auVar113._8_4_;
        auVar44._12_4_ = auVar110._12_4_ * auVar113._12_4_;
        auVar44._16_4_ = auVar110._16_4_ * auVar113._16_4_;
        auVar44._20_4_ = auVar110._20_4_ * auVar113._20_4_;
        auVar44._24_4_ = auVar110._24_4_ * auVar113._24_4_;
        auVar44._28_4_ = auVar110._28_4_;
        auVar107 = vfmsub231ps_fma(auVar44,auVar124,auVar127);
        auVar102 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar108),ZEXT1632(auVar107));
        auVar98 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT1632(auVar101),ZEXT1232(ZEXT412(0)) << 0x20
                                 );
        auVar126 = vrcp14ps_avx512vl(ZEXT1632(auVar98));
        auVar225 = ZEXT3264(auVar126);
        auVar36._8_4_ = 0x3f800000;
        auVar36._0_8_ = 0x3f8000003f800000;
        auVar36._12_4_ = 0x3f800000;
        auVar36._16_4_ = 0x3f800000;
        auVar36._20_4_ = 0x3f800000;
        auVar36._24_4_ = 0x3f800000;
        auVar36._28_4_ = 0x3f800000;
        auVar127 = vfnmadd213ps_avx512vl(auVar126,ZEXT1632(auVar98),auVar36);
        auVar102 = vfmadd132ps_fma(auVar127,auVar126,auVar126);
        auVar219 = ZEXT1664(auVar102);
        auVar45._4_4_ = auVar107._4_4_ * auVar132._4_4_;
        auVar45._0_4_ = auVar107._0_4_ * auVar132._0_4_;
        auVar45._8_4_ = auVar107._8_4_ * auVar132._8_4_;
        auVar45._12_4_ = auVar107._12_4_ * auVar132._12_4_;
        auVar45._16_4_ = fVar176 * 0.0;
        auVar45._20_4_ = fVar177 * 0.0;
        auVar45._24_4_ = fVar178 * 0.0;
        auVar45._28_4_ = iVar1;
        auVar108 = vfmadd231ps_fma(auVar45,auVar112,ZEXT1632(auVar108));
        auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar123,ZEXT1632(auVar101));
        fVar176 = auVar102._0_4_;
        fVar177 = auVar102._4_4_;
        fVar178 = auVar102._8_4_;
        fVar189 = auVar102._12_4_;
        local_560 = ZEXT1632(CONCAT412(auVar108._12_4_ * fVar189,
                                       CONCAT48(auVar108._8_4_ * fVar178,
                                                CONCAT44(auVar108._4_4_ * fVar177,
                                                         auVar108._0_4_ * fVar176))));
        auVar231 = ZEXT3264(local_560);
        auVar168._4_4_ = local_720;
        auVar168._0_4_ = local_720;
        auVar168._8_4_ = local_720;
        auVar168._12_4_ = local_720;
        auVar168._16_4_ = local_720;
        auVar168._20_4_ = local_720;
        auVar168._24_4_ = local_720;
        auVar168._28_4_ = local_720;
        uVar31 = vcmpps_avx512vl(auVar168,local_560,2);
        uVar162 = *(undefined4 *)(ray + sVar94 * 4 + 0x200);
        auVar37._4_4_ = uVar162;
        auVar37._0_4_ = uVar162;
        auVar37._8_4_ = uVar162;
        auVar37._12_4_ = uVar162;
        auVar37._16_4_ = uVar162;
        auVar37._20_4_ = uVar162;
        auVar37._24_4_ = uVar162;
        auVar37._28_4_ = uVar162;
        uVar32 = vcmpps_avx512vl(local_560,auVar37,2);
        bVar95 = (byte)uVar31 & (byte)uVar32 & bVar95;
        if (bVar95 != 0) {
          uVar92 = vcmpps_avx512vl(ZEXT1632(auVar98),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar92 = bVar95 & uVar92;
          if ((char)uVar92 != '\0') {
            fVar188 = auVar114._0_4_ * fVar176;
            fVar206 = auVar114._4_4_ * fVar177;
            auVar46._4_4_ = fVar206;
            auVar46._0_4_ = fVar188;
            fVar96 = auVar114._8_4_ * fVar178;
            auVar46._8_4_ = fVar96;
            fVar97 = auVar114._12_4_ * fVar189;
            auVar46._12_4_ = fVar97;
            fVar154 = auVar114._16_4_ * 0.0;
            auVar46._16_4_ = fVar154;
            fVar155 = auVar114._20_4_ * 0.0;
            auVar46._20_4_ = fVar155;
            fVar156 = auVar114._24_4_ * 0.0;
            auVar46._24_4_ = fVar156;
            auVar46._28_4_ = auVar114._28_4_;
            auVar169._8_4_ = 0x3f800000;
            auVar169._0_8_ = 0x3f8000003f800000;
            auVar169._12_4_ = 0x3f800000;
            auVar169._16_4_ = 0x3f800000;
            auVar169._20_4_ = 0x3f800000;
            auVar169._24_4_ = 0x3f800000;
            auVar169._28_4_ = 0x3f800000;
            auVar126 = vsubps_avx(auVar169,auVar46);
            local_5a0._0_4_ =
                 (float)((uint)(bVar84 & 1) * (int)fVar188 |
                        (uint)!(bool)(bVar84 & 1) * auVar126._0_4_);
            bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
            local_5a0._4_4_ = (float)((uint)bVar13 * (int)fVar206 | (uint)!bVar13 * auVar126._4_4_);
            bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
            local_5a0._8_4_ = (float)((uint)bVar13 * (int)fVar96 | (uint)!bVar13 * auVar126._8_4_);
            bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
            local_5a0._12_4_ = (float)((uint)bVar13 * (int)fVar97 | (uint)!bVar13 * auVar126._12_4_)
            ;
            bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
            local_5a0._16_4_ =
                 (float)((uint)bVar13 * (int)fVar154 | (uint)!bVar13 * auVar126._16_4_);
            bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
            local_5a0._20_4_ =
                 (float)((uint)bVar13 * (int)fVar155 | (uint)!bVar13 * auVar126._20_4_);
            bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
            local_5a0._24_4_ =
                 (float)((uint)bVar13 * (int)fVar156 | (uint)!bVar13 * auVar126._24_4_);
            bVar13 = SUB81(uVar85 >> 7,0);
            local_5a0._28_4_ =
                 (float)((uint)bVar13 * auVar114._28_4_ | (uint)!bVar13 * auVar126._28_4_);
            auVar126 = vsubps_avx(auVar119,auVar118);
            auVar102 = vfmadd213ps_fma(auVar126,local_5a0,auVar118);
            uVar162 = *(undefined4 *)((long)pre->ray_space + sVar94 * 4 + -0x40);
            auVar118._4_4_ = uVar162;
            auVar118._0_4_ = uVar162;
            auVar118._8_4_ = uVar162;
            auVar118._12_4_ = uVar162;
            auVar118._16_4_ = uVar162;
            auVar118._20_4_ = uVar162;
            auVar118._24_4_ = uVar162;
            auVar118._28_4_ = uVar162;
            auVar126 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar102._12_4_ + auVar102._12_4_,
                                                          CONCAT48(auVar102._8_4_ + auVar102._8_4_,
                                                                   CONCAT44(auVar102._4_4_ +
                                                                            auVar102._4_4_,
                                                                            auVar102._0_4_ +
                                                                            auVar102._0_4_)))),
                                       auVar118);
            uVar33 = vcmpps_avx512vl(local_560,auVar126,6);
            uVar92 = uVar92 & uVar33;
            bVar95 = (byte)uVar92;
            if (bVar95 != 0) {
              auVar186._0_4_ = auVar115._0_4_ * fVar176;
              auVar186._4_4_ = auVar115._4_4_ * fVar177;
              auVar186._8_4_ = auVar115._8_4_ * fVar178;
              auVar186._12_4_ = auVar115._12_4_ * fVar189;
              auVar186._16_4_ = auVar115._16_4_ * 0.0;
              auVar186._20_4_ = auVar115._20_4_ * 0.0;
              auVar186._24_4_ = auVar115._24_4_ * 0.0;
              auVar186._28_4_ = 0;
              auVar203._8_4_ = 0x3f800000;
              auVar203._0_8_ = 0x3f8000003f800000;
              auVar203._12_4_ = 0x3f800000;
              auVar203._16_4_ = 0x3f800000;
              auVar203._20_4_ = 0x3f800000;
              auVar203._24_4_ = 0x3f800000;
              auVar203._28_4_ = 0x3f800000;
              auVar126 = vsubps_avx(auVar203,auVar186);
              auVar138._0_4_ =
                   (uint)(bVar84 & 1) * (int)auVar186._0_4_ |
                   (uint)!(bool)(bVar84 & 1) * auVar126._0_4_;
              bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
              auVar138._4_4_ = (uint)bVar13 * (int)auVar186._4_4_ | (uint)!bVar13 * auVar126._4_4_;
              bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
              auVar138._8_4_ = (uint)bVar13 * (int)auVar186._8_4_ | (uint)!bVar13 * auVar126._8_4_;
              bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
              auVar138._12_4_ =
                   (uint)bVar13 * (int)auVar186._12_4_ | (uint)!bVar13 * auVar126._12_4_;
              bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
              auVar138._16_4_ =
                   (uint)bVar13 * (int)auVar186._16_4_ | (uint)!bVar13 * auVar126._16_4_;
              bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
              auVar138._20_4_ =
                   (uint)bVar13 * (int)auVar186._20_4_ | (uint)!bVar13 * auVar126._20_4_;
              bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
              auVar138._24_4_ =
                   (uint)bVar13 * (int)auVar186._24_4_ | (uint)!bVar13 * auVar126._24_4_;
              auVar138._28_4_ = (uint)!SUB81(uVar85 >> 7,0) * auVar126._28_4_;
              auVar119._8_4_ = 0x40000000;
              auVar119._0_8_ = 0x4000000040000000;
              auVar119._12_4_ = 0x40000000;
              auVar119._16_4_ = 0x40000000;
              auVar119._20_4_ = 0x40000000;
              auVar119._24_4_ = 0x40000000;
              auVar119._28_4_ = 0x40000000;
              local_580 = vfmsub132ps_avx512vl(auVar138,auVar203,auVar119);
              local_540 = 0;
              if ((pGVar90->mask & *(uint *)(ray + sVar94 * 4 + 0x240)) != 0) {
                fVar182 = 1.0 / auVar120._0_4_;
                local_4e0[0] = fVar182 * (local_5a0._0_4_ + 0.0);
                local_4e0[1] = fVar182 * (local_5a0._4_4_ + 1.0);
                local_4e0[2] = fVar182 * (local_5a0._8_4_ + 2.0);
                local_4e0[3] = fVar182 * (local_5a0._12_4_ + 3.0);
                fStack_4d0 = fVar182 * (local_5a0._16_4_ + 4.0);
                fStack_4cc = fVar182 * (local_5a0._20_4_ + 5.0);
                fStack_4c8 = fVar182 * (local_5a0._24_4_ + 6.0);
                fStack_4c4 = local_5a0._28_4_ + 7.0;
                local_4c0 = local_580;
                local_4a0 = local_560;
                auVar170._8_4_ = 0x7f800000;
                auVar170._0_8_ = 0x7f8000007f800000;
                auVar170._12_4_ = 0x7f800000;
                auVar170._16_4_ = 0x7f800000;
                auVar170._20_4_ = 0x7f800000;
                auVar170._24_4_ = 0x7f800000;
                auVar170._28_4_ = 0x7f800000;
                auVar126 = vblendmps_avx512vl(auVar170,local_560);
                auVar139._0_4_ =
                     (uint)(bVar95 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar95 & 1) * 0x7f800000;
                bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
                auVar139._4_4_ = (uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
                auVar139._8_4_ = (uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
                auVar139._12_4_ = (uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar92 >> 4) & 1);
                auVar139._16_4_ = (uint)bVar13 * auVar126._16_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar92 >> 5) & 1);
                auVar139._20_4_ = (uint)bVar13 * auVar126._20_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar92 >> 6) & 1);
                auVar139._24_4_ = (uint)bVar13 * auVar126._24_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = SUB81(uVar92 >> 7,0);
                auVar139._28_4_ = (uint)bVar13 * auVar126._28_4_ | (uint)!bVar13 * 0x7f800000;
                auVar126 = vshufps_avx(auVar139,auVar139,0xb1);
                auVar126 = vminps_avx(auVar139,auVar126);
                auVar127 = vshufpd_avx(auVar126,auVar126,5);
                auVar126 = vminps_avx(auVar126,auVar127);
                auVar127 = vpermpd_avx2(auVar126,0x4e);
                auVar126 = vminps_avx(auVar126,auVar127);
                uVar31 = vcmpps_avx512vl(auVar139,auVar126,0);
                uVar86 = (uint)uVar92;
                if ((bVar95 & (byte)uVar31) != 0) {
                  uVar86 = (uint)(bVar95 & (byte)uVar31);
                }
                uVar87 = 0;
                for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
                  uVar87 = uVar87 + 1;
                }
                uVar85 = (ulong)uVar87;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar90->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_740 = *(float *)(ray + sVar94 * 4 + 0x200);
                  fStack_73c = 0.0;
                  fStack_738 = 0.0;
                  fStack_734 = 0.0;
                  local_7e0 = auVar122;
                  local_7c0 = local_560;
                  local_53c = iVar10;
                  local_530 = auVar103;
                  local_520 = uVar30;
                  uStack_518 = uVar34;
                  local_510 = uVar77;
                  uStack_508 = uVar78;
                  local_500 = uVar79;
                  uStack_4f8 = uVar80;
                  do {
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_4e0[uVar85]));
                    local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_4c0 + uVar85 * 4)));
                    *(undefined4 *)(ray + sVar94 * 4 + 0x200) =
                         *(undefined4 *)(local_4a0 + uVar85 * 4);
                    local_840.context = context->user;
                    fVar176 = local_200._0_4_;
                    fVar182 = 1.0 - fVar176;
                    auVar101 = vfnmadd231ss_fma(ZEXT416((uint)(fVar176 * (fVar182 + fVar182))),
                                                ZEXT416((uint)fVar182),ZEXT416((uint)fVar182));
                    auVar108 = local_200._0_16_;
                    auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar108,
                                               ZEXT416(0xc0a00000));
                    auVar98 = vfmadd231ss_fma(ZEXT416((uint)(fVar176 * fVar176 * 3.0)),
                                              ZEXT416((uint)(fVar176 + fVar176)),auVar102);
                    auVar225 = ZEXT1664(auVar98);
                    auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar108,
                                               ZEXT416(0x40000000));
                    auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar182 * fVar182 * -3.0)),
                                               ZEXT416((uint)(fVar182 + fVar182)),auVar102);
                    auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar176 * fVar176)),auVar108,
                                               ZEXT416((uint)(fVar182 * -2.0)));
                    fVar182 = auVar101._0_4_ * 0.5;
                    fVar176 = auVar98._0_4_ * 0.5;
                    fVar177 = auVar102._0_4_ * 0.5;
                    fVar178 = auVar108._0_4_ * 0.5;
                    auVar201._0_4_ = fVar178 * local_8a0;
                    auVar201._4_4_ = fVar178 * fStack_89c;
                    auVar201._8_4_ = fVar178 * fStack_898;
                    auVar201._12_4_ = fVar178 * fStack_894;
                    auVar218._4_4_ = fVar177;
                    auVar218._0_4_ = fVar177;
                    auVar218._8_4_ = fVar177;
                    auVar218._12_4_ = fVar177;
                    auVar102 = vfmadd132ps_fma(auVar218,auVar201,auVar165);
                    auVar202._4_4_ = fVar176;
                    auVar202._0_4_ = fVar176;
                    auVar202._8_4_ = fVar176;
                    auVar202._12_4_ = fVar176;
                    auVar102 = vfmadd132ps_fma(auVar202,auVar102,auVar27);
                    auVar167._4_4_ = fVar182;
                    auVar167._0_4_ = fVar182;
                    auVar167._8_4_ = fVar182;
                    auVar167._12_4_ = fVar182;
                    auVar102 = vfmadd213ps_fma(auVar167,auVar103,auVar102);
                    auVar153 = vbroadcastss_avx512f(auVar102);
                    auVar213 = vbroadcastss_avx512f(ZEXT416(1));
                    auVar213 = vpermps_avx512f(auVar213,ZEXT1664(auVar102));
                    auVar219 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar219,ZEXT1664(auVar102));
                    local_2c0[0] = (RTCHitN)auVar153[0];
                    local_2c0[1] = (RTCHitN)auVar153[1];
                    local_2c0[2] = (RTCHitN)auVar153[2];
                    local_2c0[3] = (RTCHitN)auVar153[3];
                    local_2c0[4] = (RTCHitN)auVar153[4];
                    local_2c0[5] = (RTCHitN)auVar153[5];
                    local_2c0[6] = (RTCHitN)auVar153[6];
                    local_2c0[7] = (RTCHitN)auVar153[7];
                    local_2c0[8] = (RTCHitN)auVar153[8];
                    local_2c0[9] = (RTCHitN)auVar153[9];
                    local_2c0[10] = (RTCHitN)auVar153[10];
                    local_2c0[0xb] = (RTCHitN)auVar153[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar153[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar153[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar153[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar153[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar153[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar153[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar153[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar153[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar153[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar153[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar153[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar153[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar153[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar153[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar153[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar153[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar153[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar153[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar153[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar153[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar153[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar153[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar153[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar153[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar153[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar153[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar153[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar153[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar153[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar153[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar153[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar153[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar153[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar153[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar153[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar153[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar153[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar153[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar153[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar153[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar153[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar153[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar153[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar153[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar153[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar153[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar153[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar153[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar153[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar153[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar153[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar153[0x3f];
                    local_280 = auVar213;
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar153 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar153);
                    auVar122 = vpcmpeqd_avx2(auVar153._0_32_,auVar153._0_32_);
                    local_7f0[3] = auVar122;
                    local_7f0[2] = auVar122;
                    local_7f0[1] = auVar122;
                    *local_7f0 = auVar122;
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instPrimID[0]));
                    auVar153 = vmovdqa64_avx512f(local_380);
                    local_700 = vmovdqa64_avx512f(auVar153);
                    local_840.valid = (int *)local_700;
                    local_840.geometryUserPtr = pGVar90->userPtr;
                    local_840.hit = local_2c0;
                    local_840.N = 0x10;
                    local_840.ray = (RTCRayN *)ray;
                    if (pGVar90->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar213 = ZEXT1664(auVar213._0_16_);
                      auVar219 = ZEXT1664(auVar219._0_16_);
                      auVar225 = ZEXT1664(auVar98);
                      (*pGVar90->intersectionFilterN)(&local_840);
                      auVar231 = ZEXT3264(local_7c0);
                      auVar175 = ZEXT3264(local_7e0);
                      auVar239 = ZEXT3264(local_780);
                      auVar238 = ZEXT3264(local_760);
                      auVar153 = vmovdqa64_avx512f(local_700);
                      sVar94 = local_7f8;
                    }
                    uVar31 = vptestmd_avx512f(auVar153,auVar153);
                    if ((short)uVar31 == 0) {
LAB_0180b395:
                      *(float *)(ray + sVar94 * 4 + 0x200) = local_740;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar90->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar213 = ZEXT1664(auVar213._0_16_);
                        auVar219 = ZEXT1664(auVar219._0_16_);
                        auVar225 = ZEXT1664(auVar225._0_16_);
                        (*p_Var12)(&local_840);
                        auVar231 = ZEXT3264(local_7c0);
                        auVar175 = ZEXT3264(local_7e0);
                        auVar239 = ZEXT3264(local_780);
                        auVar238 = ZEXT3264(local_760);
                        auVar153 = vmovdqa64_avx512f(local_700);
                        sVar94 = local_7f8;
                      }
                      uVar33 = vptestmd_avx512f(auVar153,auVar153);
                      if ((short)uVar33 == 0) goto LAB_0180b395;
                      iVar1 = *(int *)(local_840.hit + 4);
                      iVar2 = *(int *)(local_840.hit + 8);
                      iVar64 = *(int *)(local_840.hit + 0xc);
                      iVar65 = *(int *)(local_840.hit + 0x10);
                      iVar66 = *(int *)(local_840.hit + 0x14);
                      iVar67 = *(int *)(local_840.hit + 0x18);
                      iVar68 = *(int *)(local_840.hit + 0x1c);
                      iVar69 = *(int *)(local_840.hit + 0x20);
                      iVar70 = *(int *)(local_840.hit + 0x24);
                      iVar71 = *(int *)(local_840.hit + 0x28);
                      iVar72 = *(int *)(local_840.hit + 0x2c);
                      iVar73 = *(int *)(local_840.hit + 0x30);
                      iVar74 = *(int *)(local_840.hit + 0x34);
                      iVar75 = *(int *)(local_840.hit + 0x38);
                      iVar76 = *(int *)(local_840.hit + 0x3c);
                      bVar95 = (byte)uVar33;
                      bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar33 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar33 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar33 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar33 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar33 >> 7) & 1);
                      bVar84 = (byte)(uVar33 >> 8);
                      bVar20 = (bool)((byte)(uVar33 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar33 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar33 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar33 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar33 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar33 >> 0xe) & 1);
                      bVar26 = SUB81(uVar33 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x300) =
                           (uint)(bVar95 & 1) * *(int *)local_840.hit |
                           (uint)!(bool)(bVar95 & 1) * *(int *)(local_840.ray + 0x300);
                      *(uint *)(local_840.ray + 0x304) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_840.ray + 0x304);
                      *(uint *)(local_840.ray + 0x308) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_840.ray + 0x308);
                      *(uint *)(local_840.ray + 0x30c) =
                           (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_840.ray + 0x30c);
                      *(uint *)(local_840.ray + 0x310) =
                           (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_840.ray + 0x310);
                      *(uint *)(local_840.ray + 0x314) =
                           (uint)bVar17 * iVar66 | (uint)!bVar17 * *(int *)(local_840.ray + 0x314);
                      *(uint *)(local_840.ray + 0x318) =
                           (uint)bVar18 * iVar67 | (uint)!bVar18 * *(int *)(local_840.ray + 0x318);
                      *(uint *)(local_840.ray + 0x31c) =
                           (uint)bVar19 * iVar68 | (uint)!bVar19 * *(int *)(local_840.ray + 0x31c);
                      *(uint *)(local_840.ray + 800) =
                           (uint)(bVar84 & 1) * iVar69 |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_840.ray + 800);
                      *(uint *)(local_840.ray + 0x324) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_840.ray + 0x324);
                      *(uint *)(local_840.ray + 0x328) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_840.ray + 0x328);
                      *(uint *)(local_840.ray + 0x32c) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_840.ray + 0x32c);
                      *(uint *)(local_840.ray + 0x330) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_840.ray + 0x330);
                      *(uint *)(local_840.ray + 0x334) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_840.ray + 0x334);
                      *(uint *)(local_840.ray + 0x338) =
                           (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_840.ray + 0x338);
                      *(uint *)(local_840.ray + 0x33c) =
                           (uint)bVar26 * iVar76 | (uint)!bVar26 * *(int *)(local_840.ray + 0x33c);
                      iVar1 = *(int *)(local_840.hit + 0x44);
                      iVar2 = *(int *)(local_840.hit + 0x48);
                      iVar64 = *(int *)(local_840.hit + 0x4c);
                      iVar65 = *(int *)(local_840.hit + 0x50);
                      iVar66 = *(int *)(local_840.hit + 0x54);
                      iVar67 = *(int *)(local_840.hit + 0x58);
                      iVar68 = *(int *)(local_840.hit + 0x5c);
                      iVar69 = *(int *)(local_840.hit + 0x60);
                      iVar70 = *(int *)(local_840.hit + 100);
                      iVar71 = *(int *)(local_840.hit + 0x68);
                      iVar72 = *(int *)(local_840.hit + 0x6c);
                      iVar73 = *(int *)(local_840.hit + 0x70);
                      iVar74 = *(int *)(local_840.hit + 0x74);
                      iVar75 = *(int *)(local_840.hit + 0x78);
                      iVar76 = *(int *)(local_840.hit + 0x7c);
                      bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar33 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar33 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar33 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar33 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar33 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar33 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar33 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar33 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar33 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar33 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar33 >> 0xe) & 1);
                      bVar26 = SUB81(uVar33 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x340) =
                           (uint)(bVar95 & 1) * *(int *)(local_840.hit + 0x40) |
                           (uint)!(bool)(bVar95 & 1) * *(int *)(local_840.ray + 0x340);
                      *(uint *)(local_840.ray + 0x344) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_840.ray + 0x344);
                      *(uint *)(local_840.ray + 0x348) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_840.ray + 0x348);
                      *(uint *)(local_840.ray + 0x34c) =
                           (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_840.ray + 0x34c);
                      *(uint *)(local_840.ray + 0x350) =
                           (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_840.ray + 0x350);
                      *(uint *)(local_840.ray + 0x354) =
                           (uint)bVar17 * iVar66 | (uint)!bVar17 * *(int *)(local_840.ray + 0x354);
                      *(uint *)(local_840.ray + 0x358) =
                           (uint)bVar18 * iVar67 | (uint)!bVar18 * *(int *)(local_840.ray + 0x358);
                      *(uint *)(local_840.ray + 0x35c) =
                           (uint)bVar19 * iVar68 | (uint)!bVar19 * *(int *)(local_840.ray + 0x35c);
                      *(uint *)(local_840.ray + 0x360) =
                           (uint)(bVar84 & 1) * iVar69 |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_840.ray + 0x360);
                      *(uint *)(local_840.ray + 0x364) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_840.ray + 0x364);
                      *(uint *)(local_840.ray + 0x368) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_840.ray + 0x368);
                      *(uint *)(local_840.ray + 0x36c) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_840.ray + 0x36c);
                      *(uint *)(local_840.ray + 0x370) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_840.ray + 0x370);
                      *(uint *)(local_840.ray + 0x374) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_840.ray + 0x374);
                      *(uint *)(local_840.ray + 0x378) =
                           (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_840.ray + 0x378);
                      *(uint *)(local_840.ray + 0x37c) =
                           (uint)bVar26 * iVar76 | (uint)!bVar26 * *(int *)(local_840.ray + 0x37c);
                      iVar1 = *(int *)(local_840.hit + 0x84);
                      iVar2 = *(int *)(local_840.hit + 0x88);
                      iVar64 = *(int *)(local_840.hit + 0x8c);
                      iVar65 = *(int *)(local_840.hit + 0x90);
                      iVar66 = *(int *)(local_840.hit + 0x94);
                      iVar67 = *(int *)(local_840.hit + 0x98);
                      iVar68 = *(int *)(local_840.hit + 0x9c);
                      iVar69 = *(int *)(local_840.hit + 0xa0);
                      iVar70 = *(int *)(local_840.hit + 0xa4);
                      iVar71 = *(int *)(local_840.hit + 0xa8);
                      iVar72 = *(int *)(local_840.hit + 0xac);
                      iVar73 = *(int *)(local_840.hit + 0xb0);
                      iVar74 = *(int *)(local_840.hit + 0xb4);
                      iVar75 = *(int *)(local_840.hit + 0xb8);
                      iVar76 = *(int *)(local_840.hit + 0xbc);
                      bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar33 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar33 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar33 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar33 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar33 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar33 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar33 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar33 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar33 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar33 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar33 >> 0xe) & 1);
                      bVar26 = SUB81(uVar33 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x380) =
                           (uint)(bVar95 & 1) * *(int *)(local_840.hit + 0x80) |
                           (uint)!(bool)(bVar95 & 1) * *(int *)(local_840.ray + 0x380);
                      *(uint *)(local_840.ray + 900) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_840.ray + 900);
                      *(uint *)(local_840.ray + 0x388) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_840.ray + 0x388);
                      *(uint *)(local_840.ray + 0x38c) =
                           (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_840.ray + 0x38c);
                      *(uint *)(local_840.ray + 0x390) =
                           (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_840.ray + 0x390);
                      *(uint *)(local_840.ray + 0x394) =
                           (uint)bVar17 * iVar66 | (uint)!bVar17 * *(int *)(local_840.ray + 0x394);
                      *(uint *)(local_840.ray + 0x398) =
                           (uint)bVar18 * iVar67 | (uint)!bVar18 * *(int *)(local_840.ray + 0x398);
                      *(uint *)(local_840.ray + 0x39c) =
                           (uint)bVar19 * iVar68 | (uint)!bVar19 * *(int *)(local_840.ray + 0x39c);
                      *(uint *)(local_840.ray + 0x3a0) =
                           (uint)(bVar84 & 1) * iVar69 |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_840.ray + 0x3a0);
                      *(uint *)(local_840.ray + 0x3a4) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_840.ray + 0x3a4);
                      *(uint *)(local_840.ray + 0x3a8) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_840.ray + 0x3a8);
                      *(uint *)(local_840.ray + 0x3ac) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_840.ray + 0x3ac);
                      *(uint *)(local_840.ray + 0x3b0) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_840.ray + 0x3b0);
                      *(uint *)(local_840.ray + 0x3b4) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_840.ray + 0x3b4);
                      *(uint *)(local_840.ray + 0x3b8) =
                           (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_840.ray + 0x3b8);
                      *(uint *)(local_840.ray + 0x3bc) =
                           (uint)bVar26 * iVar76 | (uint)!bVar26 * *(int *)(local_840.ray + 0x3bc);
                      iVar1 = *(int *)(local_840.hit + 0xc4);
                      iVar2 = *(int *)(local_840.hit + 200);
                      iVar64 = *(int *)(local_840.hit + 0xcc);
                      iVar65 = *(int *)(local_840.hit + 0xd0);
                      iVar66 = *(int *)(local_840.hit + 0xd4);
                      iVar67 = *(int *)(local_840.hit + 0xd8);
                      iVar68 = *(int *)(local_840.hit + 0xdc);
                      iVar69 = *(int *)(local_840.hit + 0xe0);
                      iVar70 = *(int *)(local_840.hit + 0xe4);
                      iVar71 = *(int *)(local_840.hit + 0xe8);
                      iVar72 = *(int *)(local_840.hit + 0xec);
                      iVar73 = *(int *)(local_840.hit + 0xf0);
                      iVar74 = *(int *)(local_840.hit + 0xf4);
                      iVar75 = *(int *)(local_840.hit + 0xf8);
                      iVar76 = *(int *)(local_840.hit + 0xfc);
                      bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar33 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar33 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar33 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar33 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar33 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar33 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar33 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar33 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar33 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar33 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar33 >> 0xe) & 1);
                      bVar26 = SUB81(uVar33 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x3c0) =
                           (uint)(bVar95 & 1) * *(int *)(local_840.hit + 0xc0) |
                           (uint)!(bool)(bVar95 & 1) * *(int *)(local_840.ray + 0x3c0);
                      *(uint *)(local_840.ray + 0x3c4) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_840.ray + 0x3c4);
                      *(uint *)(local_840.ray + 0x3c8) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_840.ray + 0x3c8);
                      *(uint *)(local_840.ray + 0x3cc) =
                           (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_840.ray + 0x3cc);
                      *(uint *)(local_840.ray + 0x3d0) =
                           (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_840.ray + 0x3d0);
                      *(uint *)(local_840.ray + 0x3d4) =
                           (uint)bVar17 * iVar66 | (uint)!bVar17 * *(int *)(local_840.ray + 0x3d4);
                      *(uint *)(local_840.ray + 0x3d8) =
                           (uint)bVar18 * iVar67 | (uint)!bVar18 * *(int *)(local_840.ray + 0x3d8);
                      *(uint *)(local_840.ray + 0x3dc) =
                           (uint)bVar19 * iVar68 | (uint)!bVar19 * *(int *)(local_840.ray + 0x3dc);
                      *(uint *)(local_840.ray + 0x3e0) =
                           (uint)(bVar84 & 1) * iVar69 |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_840.ray + 0x3e0);
                      *(uint *)(local_840.ray + 0x3e4) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_840.ray + 0x3e4);
                      *(uint *)(local_840.ray + 1000) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_840.ray + 1000);
                      *(uint *)(local_840.ray + 0x3ec) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_840.ray + 0x3ec);
                      *(uint *)(local_840.ray + 0x3f0) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_840.ray + 0x3f0);
                      *(uint *)(local_840.ray + 0x3f4) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_840.ray + 0x3f4);
                      *(uint *)(local_840.ray + 0x3f8) =
                           (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_840.ray + 0x3f8);
                      *(uint *)(local_840.ray + 0x3fc) =
                           (uint)bVar26 * iVar76 | (uint)!bVar26 * *(int *)(local_840.ray + 0x3fc);
                      iVar1 = *(int *)(local_840.hit + 0x104);
                      iVar2 = *(int *)(local_840.hit + 0x108);
                      iVar64 = *(int *)(local_840.hit + 0x10c);
                      iVar65 = *(int *)(local_840.hit + 0x110);
                      iVar66 = *(int *)(local_840.hit + 0x114);
                      iVar67 = *(int *)(local_840.hit + 0x118);
                      iVar68 = *(int *)(local_840.hit + 0x11c);
                      iVar69 = *(int *)(local_840.hit + 0x120);
                      iVar70 = *(int *)(local_840.hit + 0x124);
                      iVar71 = *(int *)(local_840.hit + 0x128);
                      iVar72 = *(int *)(local_840.hit + 300);
                      iVar73 = *(int *)(local_840.hit + 0x130);
                      iVar74 = *(int *)(local_840.hit + 0x134);
                      iVar75 = *(int *)(local_840.hit + 0x138);
                      iVar76 = *(int *)(local_840.hit + 0x13c);
                      bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar33 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar33 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar33 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar33 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar33 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar33 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar33 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar33 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar33 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar33 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar33 >> 0xe) & 1);
                      bVar26 = SUB81(uVar33 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x400) =
                           (uint)(bVar95 & 1) * *(int *)(local_840.hit + 0x100) |
                           (uint)!(bool)(bVar95 & 1) * *(int *)(local_840.ray + 0x400);
                      *(uint *)(local_840.ray + 0x404) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_840.ray + 0x404);
                      *(uint *)(local_840.ray + 0x408) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_840.ray + 0x408);
                      *(uint *)(local_840.ray + 0x40c) =
                           (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_840.ray + 0x40c);
                      *(uint *)(local_840.ray + 0x410) =
                           (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_840.ray + 0x410);
                      *(uint *)(local_840.ray + 0x414) =
                           (uint)bVar17 * iVar66 | (uint)!bVar17 * *(int *)(local_840.ray + 0x414);
                      *(uint *)(local_840.ray + 0x418) =
                           (uint)bVar18 * iVar67 | (uint)!bVar18 * *(int *)(local_840.ray + 0x418);
                      *(uint *)(local_840.ray + 0x41c) =
                           (uint)bVar19 * iVar68 | (uint)!bVar19 * *(int *)(local_840.ray + 0x41c);
                      *(uint *)(local_840.ray + 0x420) =
                           (uint)(bVar84 & 1) * iVar69 |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_840.ray + 0x420);
                      *(uint *)(local_840.ray + 0x424) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_840.ray + 0x424);
                      *(uint *)(local_840.ray + 0x428) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_840.ray + 0x428);
                      *(uint *)(local_840.ray + 0x42c) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_840.ray + 0x42c);
                      *(uint *)(local_840.ray + 0x430) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_840.ray + 0x430);
                      *(uint *)(local_840.ray + 0x434) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_840.ray + 0x434);
                      *(uint *)(local_840.ray + 0x438) =
                           (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_840.ray + 0x438);
                      *(uint *)(local_840.ray + 0x43c) =
                           (uint)bVar26 * iVar76 | (uint)!bVar26 * *(int *)(local_840.ray + 0x43c);
                      auVar153 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x140));
                      auVar153 = vmovdqu32_avx512f(auVar153);
                      *(undefined1 (*) [64])(local_840.ray + 0x440) = auVar153;
                      auVar153 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x180));
                      auVar153 = vmovdqu32_avx512f(auVar153);
                      *(undefined1 (*) [64])(local_840.ray + 0x480) = auVar153;
                      auVar153 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x1c0));
                      auVar153 = vmovdqa32_avx512f(auVar153);
                      *(undefined1 (*) [64])(local_840.ray + 0x4c0) = auVar153;
                      auVar153 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x200));
                      auVar153 = vmovdqa32_avx512f(auVar153);
                      *(undefined1 (*) [64])(local_840.ray + 0x500) = auVar153;
                      local_740 = *(float *)(ray + sVar94 * 4 + 0x200);
                      fStack_73c = 0.0;
                      fStack_738 = 0.0;
                      fStack_734 = 0.0;
                    }
                    auVar122 = auVar175._0_32_;
                    bVar95 = ~(byte)(1 << ((uint)uVar85 & 0x1f)) & (byte)uVar92;
                    auVar174._4_4_ = local_740;
                    auVar174._0_4_ = local_740;
                    auVar174._8_4_ = local_740;
                    auVar174._12_4_ = local_740;
                    auVar174._16_4_ = local_740;
                    auVar174._20_4_ = local_740;
                    auVar174._24_4_ = local_740;
                    auVar174._28_4_ = local_740;
                    uVar31 = vcmpps_avx512vl(auVar231._0_32_,auVar174,2);
                    if ((bVar95 & (byte)uVar31) == 0) goto LAB_0180a1eb;
                    bVar95 = bVar95 & (byte)uVar31;
                    uVar92 = (ulong)bVar95;
                    auVar122._8_4_ = 0x7f800000;
                    auVar122._0_8_ = 0x7f8000007f800000;
                    auVar122._12_4_ = 0x7f800000;
                    auVar122._16_4_ = 0x7f800000;
                    auVar122._20_4_ = 0x7f800000;
                    auVar122._24_4_ = 0x7f800000;
                    auVar122._28_4_ = 0x7f800000;
                    auVar122 = vblendmps_avx512vl(auVar122,auVar231._0_32_);
                    auVar152._0_4_ =
                         (uint)(bVar95 & 1) * auVar122._0_4_ |
                         (uint)!(bool)(bVar95 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar95 >> 1 & 1);
                    auVar152._4_4_ = (uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar95 >> 2 & 1);
                    auVar152._8_4_ = (uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar95 >> 3 & 1);
                    auVar152._12_4_ = (uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar95 >> 4 & 1);
                    auVar152._16_4_ = (uint)bVar13 * auVar122._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar95 >> 5 & 1);
                    auVar152._20_4_ = (uint)bVar13 * auVar122._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar95 >> 6 & 1);
                    auVar152._24_4_ = (uint)bVar13 * auVar122._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar152._28_4_ =
                         (uint)(bVar95 >> 7) * auVar122._28_4_ |
                         (uint)!(bool)(bVar95 >> 7) * 0x7f800000;
                    auVar122 = vshufps_avx(auVar152,auVar152,0xb1);
                    auVar122 = vminps_avx(auVar152,auVar122);
                    auVar126 = vshufpd_avx(auVar122,auVar122,5);
                    auVar122 = vminps_avx(auVar122,auVar126);
                    auVar126 = vpermpd_avx2(auVar122,0x4e);
                    auVar122 = vminps_avx(auVar122,auVar126);
                    uVar31 = vcmpps_avx512vl(auVar152,auVar122,0);
                    bVar84 = (byte)uVar31 & bVar95;
                    if (bVar84 != 0) {
                      bVar95 = bVar84;
                    }
                    uVar86 = 0;
                    for (uVar87 = (uint)bVar95; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000
                        ) {
                      uVar86 = uVar86 + 1;
                    }
                    uVar85 = (ulong)uVar86;
                  } while( true );
                }
                fVar182 = local_4e0[uVar85];
                uVar162 = *(undefined4 *)(local_4c0 + uVar85 * 4);
                fVar176 = 1.0 - fVar182;
                auVar27 = vfnmadd231ss_fma(ZEXT416((uint)(fVar182 * (fVar176 + fVar176))),
                                           ZEXT416((uint)fVar176),ZEXT416((uint)fVar176));
                auVar165 = ZEXT416((uint)fVar182);
                auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar165,
                                           ZEXT416(0xc0a00000));
                auVar98 = vfmadd231ss_fma(ZEXT416((uint)(fVar182 * fVar182 * 3.0)),
                                          ZEXT416((uint)(fVar182 + fVar182)),auVar102);
                auVar225 = ZEXT1664(auVar98);
                auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar165,
                                           ZEXT416(0x40000000));
                auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar176 * fVar176 * -3.0)),
                                           ZEXT416((uint)(fVar176 + fVar176)),auVar102);
                auVar165 = vfmadd231ss_fma(ZEXT416((uint)(fVar182 * fVar182)),auVar165,
                                           ZEXT416((uint)(fVar176 * -2.0)));
                fVar176 = auVar27._0_4_ * 0.5;
                fVar177 = auVar98._0_4_ * 0.5;
                auVar213 = ZEXT464((uint)fVar177);
                fVar178 = auVar102._0_4_ * 0.5;
                fVar189 = auVar165._0_4_ * 0.5;
                auVar195._0_4_ = fVar189 * local_8a0;
                auVar195._4_4_ = fVar189 * fStack_89c;
                auVar195._8_4_ = fVar189 * fStack_898;
                auVar195._12_4_ = fVar189 * fStack_894;
                auVar215._4_4_ = fVar178;
                auVar215._0_4_ = fVar178;
                auVar215._8_4_ = fVar178;
                auVar215._12_4_ = fVar178;
                auVar102 = vfmadd132ps_fma(auVar215,auVar195,*pauVar4);
                auVar219 = ZEXT1664(auVar102);
                auVar196._4_4_ = fVar177;
                auVar196._0_4_ = fVar177;
                auVar196._8_4_ = fVar177;
                auVar196._12_4_ = fVar177;
                auVar102 = vfmadd132ps_fma(auVar196,auVar102,*pauVar3);
                auVar184._4_4_ = fVar176;
                auVar184._0_4_ = fVar176;
                auVar184._8_4_ = fVar176;
                auVar184._12_4_ = fVar176;
                auVar102 = vfmadd213ps_fma(auVar184,auVar103,auVar102);
                *(undefined4 *)(ray + sVar94 * 4 + 0x200) = *(undefined4 *)(local_4a0 + uVar85 * 4);
                *(int *)(ray + sVar94 * 4 + 0x300) = auVar102._0_4_;
                uVar11 = vextractps_avx(auVar102,1);
                *(undefined4 *)(ray + sVar94 * 4 + 0x340) = uVar11;
                uVar11 = vextractps_avx(auVar102,2);
                *(undefined4 *)(ray + sVar94 * 4 + 0x380) = uVar11;
                *(float *)(ray + sVar94 * 4 + 0x3c0) = fVar182;
                *(undefined4 *)(ray + sVar94 * 4 + 0x400) = uVar162;
                *(uint *)(ray + sVar94 * 4 + 0x440) = uVar9;
                *(uint *)(ray + sVar94 * 4 + 0x480) = uVar8;
                *(uint *)(ray + sVar94 * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + sVar94 * 4 + 0x500) = context->user->instPrimID[0];
LAB_0180a1eb:
                fVar182 = (float)local_810._0_4_;
              }
            }
          }
        }
      }
    }
    local_810._0_4_ = fVar182;
    if (8 < iVar10) {
      auVar126 = vpbroadcastd_avx512vl();
      auVar175 = ZEXT3264(auVar126);
      local_740 = (float)local_810._0_4_;
      fStack_73c = (float)local_810._0_4_;
      fStack_738 = (float)local_810._0_4_;
      fStack_734 = (float)local_810._0_4_;
      fStack_730 = (float)local_810._0_4_;
      fStack_72c = (float)local_810._0_4_;
      fStack_728 = (float)local_810._0_4_;
      fStack_724 = (float)local_810._0_4_;
      uStack_71c = local_720;
      uStack_718 = local_720;
      uStack_714 = local_720;
      uStack_710 = local_720;
      uStack_70c = local_720;
      uStack_708 = local_720;
      uStack_704 = local_720;
      local_420 = 1.0 / (float)local_7a0._0_4_;
      fStack_41c = local_420;
      fStack_418 = local_420;
      fStack_414 = local_420;
      fStack_410 = local_420;
      fStack_40c = local_420;
      fStack_408 = local_420;
      fStack_404 = local_420;
      lVar89 = 8;
      local_7e0 = auVar122;
LAB_0180a289:
      if (lVar89 < lVar88) {
        auVar122 = vpbroadcastd_avx512vl();
        auVar122 = vpor_avx2(auVar122,_DAT_01fb4ba0);
        uVar32 = vpcmpgtd_avx512vl(auVar175._0_32_,auVar122);
        auVar122 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar89 * 4 + lVar93);
        auVar126 = *(undefined1 (*) [32])(lVar93 + 0x22047f0 + lVar89 * 4);
        auVar127 = *(undefined1 (*) [32])(lVar93 + 0x2204c74 + lVar89 * 4);
        auVar125 = *(undefined1 (*) [32])(lVar93 + 0x22050f8 + lVar89 * 4);
        auVar231._0_4_ = auVar125._0_4_ * (float)local_680._0_4_;
        auVar231._4_4_ = auVar125._4_4_ * (float)local_680._4_4_;
        auVar231._8_4_ = auVar125._8_4_ * fStack_678;
        auVar231._12_4_ = auVar125._12_4_ * fStack_674;
        auVar231._16_4_ = auVar125._16_4_ * fStack_670;
        auVar231._20_4_ = auVar125._20_4_ * fStack_66c;
        auVar231._28_36_ = auVar219._28_36_;
        auVar231._24_4_ = auVar125._24_4_ * fStack_668;
        auVar219._0_4_ = auVar125._0_4_ * (float)local_6a0._0_4_;
        auVar219._4_4_ = auVar125._4_4_ * (float)local_6a0._4_4_;
        auVar219._8_4_ = auVar125._8_4_ * fStack_698;
        auVar219._12_4_ = auVar125._12_4_ * fStack_694;
        auVar219._16_4_ = auVar125._16_4_ * fStack_690;
        auVar219._20_4_ = auVar125._20_4_ * fStack_68c;
        auVar219._28_36_ = auVar213._28_36_;
        auVar219._24_4_ = auVar125._24_4_ * fStack_688;
        auVar124 = vmulps_avx512vl(local_400,auVar125);
        local_760 = auVar238._0_32_;
        auVar110 = vfmadd231ps_avx512vl(auVar231._0_32_,auVar127,local_640);
        auVar111 = vfmadd231ps_avx512vl(auVar219._0_32_,auVar127,local_660);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar127,local_3e0);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar126,local_600);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar126,local_620);
        auVar123 = vfmadd231ps_avx512vl(auVar124,auVar126,local_3c0);
        auVar102 = vfmadd231ps_fma(auVar110,auVar122,local_5c0);
        auVar219 = ZEXT1664(auVar102);
        auVar98 = vfmadd231ps_fma(auVar111,auVar122,local_5e0);
        auVar213 = ZEXT1664(auVar98);
        auVar124 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar89 * 4 + lVar93);
        auVar110 = *(undefined1 (*) [32])(lVar93 + 0x2206c10 + lVar89 * 4);
        auVar114 = vfmadd231ps_avx512vl(auVar123,auVar122,local_3a0);
        auVar111 = *(undefined1 (*) [32])(lVar93 + 0x2207094 + lVar89 * 4);
        auVar123 = *(undefined1 (*) [32])(lVar93 + 0x2207518 + lVar89 * 4);
        auVar238._0_4_ = auVar123._0_4_ * (float)local_680._0_4_;
        auVar238._4_4_ = auVar123._4_4_ * (float)local_680._4_4_;
        auVar238._8_4_ = auVar123._8_4_ * fStack_678;
        auVar238._12_4_ = auVar123._12_4_ * fStack_674;
        auVar238._16_4_ = auVar123._16_4_ * fStack_670;
        auVar238._20_4_ = auVar123._20_4_ * fStack_66c;
        auVar238._28_36_ = auVar225._28_36_;
        auVar238._24_4_ = auVar123._24_4_ * fStack_668;
        auVar47._4_4_ = auVar123._4_4_ * (float)local_6a0._4_4_;
        auVar47._0_4_ = auVar123._0_4_ * (float)local_6a0._0_4_;
        auVar47._8_4_ = auVar123._8_4_ * fStack_698;
        auVar47._12_4_ = auVar123._12_4_ * fStack_694;
        auVar47._16_4_ = auVar123._16_4_ * fStack_690;
        auVar47._20_4_ = auVar123._20_4_ * fStack_68c;
        auVar47._24_4_ = auVar123._24_4_ * fStack_688;
        auVar47._28_4_ = uStack_684;
        auVar112 = vmulps_avx512vl(local_400,auVar123);
        auVar113 = vfmadd231ps_avx512vl(auVar238._0_32_,auVar111,local_640);
        auVar238 = ZEXT3264(local_760);
        auVar115 = vfmadd231ps_avx512vl(auVar47,auVar111,local_660);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar111,local_3e0);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar110,local_600);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar110,local_620);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar110,local_3c0);
        auVar165 = vfmadd231ps_fma(auVar113,auVar124,local_5c0);
        auVar225 = ZEXT1664(auVar165);
        auVar27 = vfmadd231ps_fma(auVar115,auVar124,local_5e0);
        auVar115 = vfmadd231ps_avx512vl(auVar112,auVar124,local_3a0);
        auVar116 = vmaxps_avx512vl(auVar114,auVar115);
        auVar112 = vsubps_avx(ZEXT1632(auVar165),ZEXT1632(auVar102));
        auVar113 = vsubps_avx(ZEXT1632(auVar27),ZEXT1632(auVar98));
        auVar117 = vmulps_avx512vl(ZEXT1632(auVar98),auVar112);
        auVar118 = vmulps_avx512vl(ZEXT1632(auVar102),auVar113);
        auVar117 = vsubps_avx512vl(auVar117,auVar118);
        auVar118 = vmulps_avx512vl(auVar113,auVar113);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar112,auVar112);
        auVar116 = vmulps_avx512vl(auVar116,auVar116);
        auVar116 = vmulps_avx512vl(auVar116,auVar118);
        auVar117 = vmulps_avx512vl(auVar117,auVar117);
        uVar31 = vcmpps_avx512vl(auVar117,auVar116,2);
        bVar95 = (byte)uVar32 & (byte)uVar31;
        if (bVar95 != 0) {
          auVar123 = vmulps_avx512vl(local_460,auVar123);
          auVar111 = vfmadd213ps_avx512vl(auVar111,local_7e0,auVar123);
          local_780 = auVar239._0_32_;
          auVar110 = vfmadd213ps_avx512vl(auVar110,local_780,auVar111);
          auVar124 = vfmadd213ps_avx512vl(auVar124,local_760,auVar110);
          auVar125 = vmulps_avx512vl(local_460,auVar125);
          auVar127 = vfmadd213ps_avx512vl(auVar127,local_7e0,auVar125);
          auVar126 = vfmadd213ps_avx512vl(auVar126,local_780,auVar127);
          auVar110 = vfmadd213ps_avx512vl(auVar122,local_760,auVar126);
          auVar122 = *(undefined1 (*) [32])(lVar93 + 0x220557c + lVar89 * 4);
          auVar126 = *(undefined1 (*) [32])(lVar93 + 0x2205a00 + lVar89 * 4);
          auVar127 = *(undefined1 (*) [32])(lVar93 + 0x2205e84 + lVar89 * 4);
          auVar125 = *(undefined1 (*) [32])(lVar93 + 0x2206308 + lVar89 * 4);
          auVar111 = vmulps_avx512vl(_local_680,auVar125);
          auVar123 = vmulps_avx512vl(_local_6a0,auVar125);
          auVar125 = vmulps_avx512vl(local_460,auVar125);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar127,local_640);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar127,local_660);
          auVar108 = vfmadd231ps_fma(auVar125,auVar127,local_7e0);
          auVar127 = vfmadd231ps_avx512vl(auVar111,auVar126,local_600);
          auVar125 = vfmadd231ps_avx512vl(auVar123,auVar126,local_620);
          auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar108),local_780,auVar126);
          auVar111 = vfmadd231ps_avx512vl(auVar127,auVar122,local_5c0);
          auVar125 = vfmadd231ps_avx512vl(auVar125,auVar122,local_5e0);
          auVar123 = vfmadd231ps_avx512vl(auVar126,local_760,auVar122);
          auVar122 = *(undefined1 (*) [32])(lVar93 + 0x220799c + lVar89 * 4);
          auVar126 = *(undefined1 (*) [32])(lVar93 + 0x22082a4 + lVar89 * 4);
          auVar127 = *(undefined1 (*) [32])(lVar93 + 0x2208728 + lVar89 * 4);
          auVar116 = vmulps_avx512vl(_local_680,auVar127);
          auVar117 = vmulps_avx512vl(_local_6a0,auVar127);
          auVar127 = vmulps_avx512vl(local_460,auVar127);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar126,local_640);
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar126,local_660);
          auVar127 = vfmadd231ps_avx512vl(auVar127,local_7e0,auVar126);
          auVar126 = *(undefined1 (*) [32])(lVar93 + 0x2207e20 + lVar89 * 4);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar126,local_600);
          auVar238 = ZEXT3264(local_760);
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar126,local_620);
          auVar126 = vfmadd231ps_avx512vl(auVar127,local_780,auVar126);
          auVar127 = vfmadd231ps_avx512vl(auVar116,auVar122,local_5c0);
          auVar116 = vfmadd231ps_avx512vl(auVar117,auVar122,local_5e0);
          auVar126 = vfmadd231ps_avx512vl(auVar126,local_760,auVar122);
          auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar111,auVar117);
          vandps_avx512vl(auVar125,auVar117);
          auVar122 = vmaxps_avx(auVar117,auVar117);
          vandps_avx512vl(auVar123,auVar117);
          auVar122 = vmaxps_avx(auVar122,auVar117);
          auVar82._4_4_ = fStack_73c;
          auVar82._0_4_ = local_740;
          auVar82._8_4_ = fStack_738;
          auVar82._12_4_ = fStack_734;
          auVar82._16_4_ = fStack_730;
          auVar82._20_4_ = fStack_72c;
          auVar82._24_4_ = fStack_728;
          auVar82._28_4_ = fStack_724;
          uVar85 = vcmpps_avx512vl(auVar122,auVar82,1);
          bVar13 = (bool)((byte)uVar85 & 1);
          auVar140._0_4_ = (float)((uint)bVar13 * auVar112._0_4_ | (uint)!bVar13 * auVar111._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar140._4_4_ = (float)((uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar111._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar140._8_4_ = (float)((uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar111._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar140._12_4_ =
               (float)((uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar111._12_4_);
          bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar140._16_4_ =
               (float)((uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * auVar111._16_4_);
          bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar140._20_4_ =
               (float)((uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * auVar111._20_4_);
          bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar140._24_4_ =
               (float)((uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * auVar111._24_4_);
          bVar13 = SUB81(uVar85 >> 7,0);
          auVar140._28_4_ = (uint)bVar13 * auVar112._28_4_ | (uint)!bVar13 * auVar111._28_4_;
          bVar13 = (bool)((byte)uVar85 & 1);
          auVar141._0_4_ = (float)((uint)bVar13 * auVar113._0_4_ | (uint)!bVar13 * auVar125._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar141._4_4_ = (float)((uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar125._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar141._8_4_ = (float)((uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar125._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar141._12_4_ =
               (float)((uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar125._12_4_);
          bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar141._16_4_ =
               (float)((uint)bVar13 * auVar113._16_4_ | (uint)!bVar13 * auVar125._16_4_);
          bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar141._20_4_ =
               (float)((uint)bVar13 * auVar113._20_4_ | (uint)!bVar13 * auVar125._20_4_);
          bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar141._24_4_ =
               (float)((uint)bVar13 * auVar113._24_4_ | (uint)!bVar13 * auVar125._24_4_);
          bVar13 = SUB81(uVar85 >> 7,0);
          auVar141._28_4_ = (uint)bVar13 * auVar113._28_4_ | (uint)!bVar13 * auVar125._28_4_;
          vandps_avx512vl(auVar127,auVar117);
          vandps_avx512vl(auVar116,auVar117);
          auVar122 = vmaxps_avx(auVar141,auVar141);
          vandps_avx512vl(auVar126,auVar117);
          auVar122 = vmaxps_avx(auVar122,auVar141);
          uVar85 = vcmpps_avx512vl(auVar122,auVar82,1);
          bVar13 = (bool)((byte)uVar85 & 1);
          auVar142._0_4_ = (uint)bVar13 * auVar112._0_4_ | (uint)!bVar13 * auVar127._0_4_;
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar142._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar127._4_4_;
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar142._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar127._8_4_;
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar142._12_4_ = (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar127._12_4_;
          bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar142._16_4_ = (uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * auVar127._16_4_;
          bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar142._20_4_ = (uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * auVar127._20_4_;
          bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar142._24_4_ = (uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * auVar127._24_4_;
          bVar13 = SUB81(uVar85 >> 7,0);
          auVar142._28_4_ = (uint)bVar13 * auVar112._28_4_ | (uint)!bVar13 * auVar127._28_4_;
          bVar13 = (bool)((byte)uVar85 & 1);
          auVar143._0_4_ = (float)((uint)bVar13 * auVar113._0_4_ | (uint)!bVar13 * auVar116._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar143._4_4_ = (float)((uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar116._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar143._8_4_ = (float)((uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar116._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar143._12_4_ =
               (float)((uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar116._12_4_);
          bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar143._16_4_ =
               (float)((uint)bVar13 * auVar113._16_4_ | (uint)!bVar13 * auVar116._16_4_);
          bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar143._20_4_ =
               (float)((uint)bVar13 * auVar113._20_4_ | (uint)!bVar13 * auVar116._20_4_);
          bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar143._24_4_ =
               (float)((uint)bVar13 * auVar113._24_4_ | (uint)!bVar13 * auVar116._24_4_);
          bVar13 = SUB81(uVar85 >> 7,0);
          auVar143._28_4_ = (uint)bVar13 * auVar113._28_4_ | (uint)!bVar13 * auVar116._28_4_;
          auVar229._8_4_ = 0x80000000;
          auVar229._0_8_ = 0x8000000080000000;
          auVar229._12_4_ = 0x80000000;
          auVar229._16_4_ = 0x80000000;
          auVar229._20_4_ = 0x80000000;
          auVar229._24_4_ = 0x80000000;
          auVar229._28_4_ = 0x80000000;
          auVar122 = vxorps_avx512vl(auVar142,auVar229);
          auVar109 = vxorps_avx512vl(auVar117._0_16_,auVar117._0_16_);
          auVar126 = vfmadd213ps_avx512vl(auVar140,auVar140,ZEXT1632(auVar109));
          auVar108 = vfmadd231ps_fma(auVar126,auVar141,auVar141);
          auVar126 = vrsqrt14ps_avx512vl(ZEXT1632(auVar108));
          auVar237._8_4_ = 0xbf000000;
          auVar237._0_8_ = 0xbf000000bf000000;
          auVar237._12_4_ = 0xbf000000;
          auVar237._16_4_ = 0xbf000000;
          auVar237._20_4_ = 0xbf000000;
          auVar237._24_4_ = 0xbf000000;
          auVar237._28_4_ = 0xbf000000;
          fVar182 = auVar126._0_4_;
          fVar176 = auVar126._4_4_;
          fVar177 = auVar126._8_4_;
          fVar178 = auVar126._12_4_;
          fVar189 = auVar126._16_4_;
          fVar188 = auVar126._20_4_;
          fVar206 = auVar126._24_4_;
          auVar48._4_4_ = fVar176 * fVar176 * fVar176 * auVar108._4_4_ * -0.5;
          auVar48._0_4_ = fVar182 * fVar182 * fVar182 * auVar108._0_4_ * -0.5;
          auVar48._8_4_ = fVar177 * fVar177 * fVar177 * auVar108._8_4_ * -0.5;
          auVar48._12_4_ = fVar178 * fVar178 * fVar178 * auVar108._12_4_ * -0.5;
          auVar48._16_4_ = fVar189 * fVar189 * fVar189 * -0.0;
          auVar48._20_4_ = fVar188 * fVar188 * fVar188 * -0.0;
          auVar48._24_4_ = fVar206 * fVar206 * fVar206 * -0.0;
          auVar48._28_4_ = auVar141._28_4_;
          auVar127 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar126 = vfmadd231ps_avx512vl(auVar48,auVar127,auVar126);
          auVar49._4_4_ = auVar141._4_4_ * auVar126._4_4_;
          auVar49._0_4_ = auVar141._0_4_ * auVar126._0_4_;
          auVar49._8_4_ = auVar141._8_4_ * auVar126._8_4_;
          auVar49._12_4_ = auVar141._12_4_ * auVar126._12_4_;
          auVar49._16_4_ = auVar141._16_4_ * auVar126._16_4_;
          auVar49._20_4_ = auVar141._20_4_ * auVar126._20_4_;
          auVar49._24_4_ = auVar141._24_4_ * auVar126._24_4_;
          auVar49._28_4_ = 0;
          auVar50._4_4_ = auVar126._4_4_ * -auVar140._4_4_;
          auVar50._0_4_ = auVar126._0_4_ * -auVar140._0_4_;
          auVar50._8_4_ = auVar126._8_4_ * -auVar140._8_4_;
          auVar50._12_4_ = auVar126._12_4_ * -auVar140._12_4_;
          auVar50._16_4_ = auVar126._16_4_ * -auVar140._16_4_;
          auVar50._20_4_ = auVar126._20_4_ * -auVar140._20_4_;
          auVar50._24_4_ = auVar126._24_4_ * -auVar140._24_4_;
          auVar50._28_4_ = auVar141._28_4_;
          auVar125 = vmulps_avx512vl(auVar126,ZEXT1632(auVar109));
          auVar123 = ZEXT1632(auVar109);
          auVar126 = vfmadd213ps_avx512vl(auVar142,auVar142,auVar123);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar143,auVar143);
          auVar111 = vrsqrt14ps_avx512vl(auVar126);
          auVar126 = vmulps_avx512vl(auVar126,auVar237);
          fVar182 = auVar111._0_4_;
          fVar176 = auVar111._4_4_;
          fVar177 = auVar111._8_4_;
          fVar178 = auVar111._12_4_;
          fVar189 = auVar111._16_4_;
          fVar188 = auVar111._20_4_;
          fVar206 = auVar111._24_4_;
          auVar51._4_4_ = fVar176 * fVar176 * fVar176 * auVar126._4_4_;
          auVar51._0_4_ = fVar182 * fVar182 * fVar182 * auVar126._0_4_;
          auVar51._8_4_ = fVar177 * fVar177 * fVar177 * auVar126._8_4_;
          auVar51._12_4_ = fVar178 * fVar178 * fVar178 * auVar126._12_4_;
          auVar51._16_4_ = fVar189 * fVar189 * fVar189 * auVar126._16_4_;
          auVar51._20_4_ = fVar188 * fVar188 * fVar188 * auVar126._20_4_;
          auVar51._24_4_ = fVar206 * fVar206 * fVar206 * auVar126._24_4_;
          auVar51._28_4_ = auVar126._28_4_;
          auVar126 = vfmadd231ps_avx512vl(auVar51,auVar127,auVar111);
          auVar52._4_4_ = auVar143._4_4_ * auVar126._4_4_;
          auVar52._0_4_ = auVar143._0_4_ * auVar126._0_4_;
          auVar52._8_4_ = auVar143._8_4_ * auVar126._8_4_;
          auVar52._12_4_ = auVar143._12_4_ * auVar126._12_4_;
          auVar52._16_4_ = auVar143._16_4_ * auVar126._16_4_;
          auVar52._20_4_ = auVar143._20_4_ * auVar126._20_4_;
          auVar52._24_4_ = auVar143._24_4_ * auVar126._24_4_;
          auVar52._28_4_ = auVar111._28_4_;
          auVar53._4_4_ = auVar126._4_4_ * auVar122._4_4_;
          auVar53._0_4_ = auVar126._0_4_ * auVar122._0_4_;
          auVar53._8_4_ = auVar126._8_4_ * auVar122._8_4_;
          auVar53._12_4_ = auVar126._12_4_ * auVar122._12_4_;
          auVar53._16_4_ = auVar126._16_4_ * auVar122._16_4_;
          auVar53._20_4_ = auVar126._20_4_ * auVar122._20_4_;
          auVar53._24_4_ = auVar126._24_4_ * auVar122._24_4_;
          auVar53._28_4_ = auVar122._28_4_;
          auVar122 = vmulps_avx512vl(auVar126,auVar123);
          auVar108 = vfmadd213ps_fma(auVar49,auVar114,ZEXT1632(auVar102));
          auVar101 = vfmadd213ps_fma(auVar50,auVar114,ZEXT1632(auVar98));
          auVar127 = vfmadd213ps_avx512vl(auVar125,auVar114,auVar110);
          auVar111 = vfmadd213ps_avx512vl(auVar52,auVar115,ZEXT1632(auVar165));
          auVar104 = vfnmadd213ps_fma(auVar49,auVar114,ZEXT1632(auVar102));
          auVar102 = vfmadd213ps_fma(auVar53,auVar115,ZEXT1632(auVar27));
          auVar163 = vfnmadd213ps_fma(auVar50,auVar114,ZEXT1632(auVar98));
          auVar98 = vfmadd213ps_fma(auVar122,auVar115,auVar124);
          auVar106 = vfnmadd231ps_fma(auVar110,auVar114,auVar125);
          auVar164 = vfnmadd213ps_fma(auVar52,auVar115,ZEXT1632(auVar165));
          auVar105 = vfnmadd213ps_fma(auVar53,auVar115,ZEXT1632(auVar27));
          auVar179 = vfnmadd231ps_fma(auVar124,auVar115,auVar122);
          auVar124 = vsubps_avx512vl(auVar111,ZEXT1632(auVar104));
          auVar122 = vsubps_avx(ZEXT1632(auVar102),ZEXT1632(auVar163));
          auVar126 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar106));
          auVar54._4_4_ = auVar122._4_4_ * auVar106._4_4_;
          auVar54._0_4_ = auVar122._0_4_ * auVar106._0_4_;
          auVar54._8_4_ = auVar122._8_4_ * auVar106._8_4_;
          auVar54._12_4_ = auVar122._12_4_ * auVar106._12_4_;
          auVar54._16_4_ = auVar122._16_4_ * 0.0;
          auVar54._20_4_ = auVar122._20_4_ * 0.0;
          auVar54._24_4_ = auVar122._24_4_ * 0.0;
          auVar54._28_4_ = auVar125._28_4_;
          auVar165 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar163),auVar126);
          auVar55._4_4_ = auVar126._4_4_ * auVar104._4_4_;
          auVar55._0_4_ = auVar126._0_4_ * auVar104._0_4_;
          auVar55._8_4_ = auVar126._8_4_ * auVar104._8_4_;
          auVar55._12_4_ = auVar126._12_4_ * auVar104._12_4_;
          auVar55._16_4_ = auVar126._16_4_ * 0.0;
          auVar55._20_4_ = auVar126._20_4_ * 0.0;
          auVar55._24_4_ = auVar126._24_4_ * 0.0;
          auVar55._28_4_ = auVar126._28_4_;
          auVar27 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar106),auVar124);
          auVar56._4_4_ = auVar163._4_4_ * auVar124._4_4_;
          auVar56._0_4_ = auVar163._0_4_ * auVar124._0_4_;
          auVar56._8_4_ = auVar163._8_4_ * auVar124._8_4_;
          auVar56._12_4_ = auVar163._12_4_ * auVar124._12_4_;
          auVar56._16_4_ = auVar124._16_4_ * 0.0;
          auVar56._20_4_ = auVar124._20_4_ * 0.0;
          auVar56._24_4_ = auVar124._24_4_ * 0.0;
          auVar56._28_4_ = auVar124._28_4_;
          auVar107 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar104),auVar122);
          auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),auVar123,ZEXT1632(auVar27));
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar123,ZEXT1632(auVar165));
          auVar117 = ZEXT1632(auVar109);
          uVar85 = vcmpps_avx512vl(auVar122,auVar117,2);
          bVar84 = (byte)uVar85;
          fVar154 = (float)((uint)(bVar84 & 1) * auVar108._0_4_ |
                           (uint)!(bool)(bVar84 & 1) * auVar164._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          fVar156 = (float)((uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar164._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          fVar158 = (float)((uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar164._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          fVar160 = (float)((uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar164._12_4_);
          auVar123 = ZEXT1632(CONCAT412(fVar160,CONCAT48(fVar158,CONCAT44(fVar156,fVar154))));
          fVar155 = (float)((uint)(bVar84 & 1) * auVar101._0_4_ |
                           (uint)!(bool)(bVar84 & 1) * auVar105._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          fVar157 = (float)((uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar105._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          fVar159 = (float)((uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar105._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          fVar161 = (float)((uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar105._12_4_);
          auVar112 = ZEXT1632(CONCAT412(fVar161,CONCAT48(fVar159,CONCAT44(fVar157,fVar155))));
          auVar144._0_4_ =
               (float)((uint)(bVar84 & 1) * auVar127._0_4_ |
                      (uint)!(bool)(bVar84 & 1) * auVar179._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar144._4_4_ = (float)((uint)bVar13 * auVar127._4_4_ | (uint)!bVar13 * auVar179._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar144._8_4_ = (float)((uint)bVar13 * auVar127._8_4_ | (uint)!bVar13 * auVar179._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar144._12_4_ =
               (float)((uint)bVar13 * auVar127._12_4_ | (uint)!bVar13 * auVar179._12_4_);
          fVar177 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar127._16_4_);
          auVar144._16_4_ = fVar177;
          fVar176 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar127._20_4_);
          auVar144._20_4_ = fVar176;
          fVar182 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar127._24_4_);
          auVar144._24_4_ = fVar182;
          iVar1 = (uint)(byte)(uVar85 >> 7) * auVar127._28_4_;
          auVar144._28_4_ = iVar1;
          auVar122 = vblendmps_avx512vl(ZEXT1632(auVar104),auVar111);
          auVar145._0_4_ =
               (uint)(bVar84 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar165._0_4_;
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar145._4_4_ = (uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * auVar165._4_4_;
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar145._8_4_ = (uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * auVar165._8_4_;
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar145._12_4_ = (uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * auVar165._12_4_;
          auVar145._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * auVar122._16_4_;
          auVar145._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * auVar122._20_4_;
          auVar145._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * auVar122._24_4_;
          auVar145._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar122._28_4_;
          auVar122 = vblendmps_avx512vl(ZEXT1632(auVar163),ZEXT1632(auVar102));
          auVar146._0_4_ =
               (float)((uint)(bVar84 & 1) * auVar122._0_4_ |
                      (uint)!(bool)(bVar84 & 1) * auVar108._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar146._4_4_ = (float)((uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * auVar108._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar146._8_4_ = (float)((uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * auVar108._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar146._12_4_ =
               (float)((uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * auVar108._12_4_);
          fVar188 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar122._16_4_);
          auVar146._16_4_ = fVar188;
          fVar189 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar122._20_4_);
          auVar146._20_4_ = fVar189;
          fVar178 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar122._24_4_);
          auVar146._24_4_ = fVar178;
          auVar146._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar122._28_4_;
          auVar122 = vblendmps_avx512vl(ZEXT1632(auVar106),ZEXT1632(auVar98));
          auVar147._0_4_ =
               (float)((uint)(bVar84 & 1) * auVar122._0_4_ |
                      (uint)!(bool)(bVar84 & 1) * auVar101._0_4_);
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar147._4_4_ = (float)((uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * auVar101._4_4_);
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar147._8_4_ = (float)((uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * auVar101._8_4_);
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar147._12_4_ =
               (float)((uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * auVar101._12_4_);
          fVar96 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar122._16_4_);
          auVar147._16_4_ = fVar96;
          fVar97 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar122._20_4_);
          auVar147._20_4_ = fVar97;
          fVar206 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar122._24_4_);
          auVar147._24_4_ = fVar206;
          iVar2 = (uint)(byte)(uVar85 >> 7) * auVar122._28_4_;
          auVar147._28_4_ = iVar2;
          auVar148._0_4_ =
               (uint)(bVar84 & 1) * (int)auVar104._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar111._0_4_
          ;
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar148._4_4_ = (uint)bVar13 * (int)auVar104._4_4_ | (uint)!bVar13 * auVar111._4_4_;
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar148._8_4_ = (uint)bVar13 * (int)auVar104._8_4_ | (uint)!bVar13 * auVar111._8_4_;
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar148._12_4_ = (uint)bVar13 * (int)auVar104._12_4_ | (uint)!bVar13 * auVar111._12_4_;
          auVar148._16_4_ = (uint)!(bool)((byte)(uVar85 >> 4) & 1) * auVar111._16_4_;
          auVar148._20_4_ = (uint)!(bool)((byte)(uVar85 >> 5) & 1) * auVar111._20_4_;
          auVar148._24_4_ = (uint)!(bool)((byte)(uVar85 >> 6) & 1) * auVar111._24_4_;
          auVar148._28_4_ = (uint)!SUB81(uVar85 >> 7,0) * auVar111._28_4_;
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar85 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar85 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar85 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar111 = vsubps_avx512vl(auVar148,auVar123);
          auVar126 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar163._12_4_ |
                                                   (uint)!bVar17 * auVar102._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar163._8_4_ |
                                                            (uint)!bVar15 * auVar102._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar163._4_4_ |
                                                                     (uint)!bVar13 * auVar102._4_4_,
                                                                     (uint)(bVar84 & 1) *
                                                                     (int)auVar163._0_4_ |
                                                                     (uint)!(bool)(bVar84 & 1) *
                                                                     auVar102._0_4_)))),auVar112);
          auVar219 = ZEXT3264(auVar126);
          auVar127 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar106._12_4_ |
                                                   (uint)!bVar18 * auVar98._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar106._8_4_ |
                                                            (uint)!bVar16 * auVar98._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar106._4_4_ |
                                                                     (uint)!bVar14 * auVar98._4_4_,
                                                                     (uint)(bVar84 & 1) *
                                                                     (int)auVar106._0_4_ |
                                                                     (uint)!(bool)(bVar84 & 1) *
                                                                     auVar98._0_4_)))),auVar144);
          auVar125 = vsubps_avx(auVar123,auVar145);
          auVar225 = ZEXT3264(auVar125);
          auVar124 = vsubps_avx(auVar112,auVar146);
          auVar110 = vsubps_avx(auVar144,auVar147);
          auVar57._4_4_ = auVar127._4_4_ * fVar156;
          auVar57._0_4_ = auVar127._0_4_ * fVar154;
          auVar57._8_4_ = auVar127._8_4_ * fVar158;
          auVar57._12_4_ = auVar127._12_4_ * fVar160;
          auVar57._16_4_ = auVar127._16_4_ * 0.0;
          auVar57._20_4_ = auVar127._20_4_ * 0.0;
          auVar57._24_4_ = auVar127._24_4_ * 0.0;
          auVar57._28_4_ = 0;
          auVar102 = vfmsub231ps_fma(auVar57,auVar144,auVar111);
          auVar204._0_4_ = fVar155 * auVar111._0_4_;
          auVar204._4_4_ = fVar157 * auVar111._4_4_;
          auVar204._8_4_ = fVar159 * auVar111._8_4_;
          auVar204._12_4_ = fVar161 * auVar111._12_4_;
          auVar204._16_4_ = auVar111._16_4_ * 0.0;
          auVar204._20_4_ = auVar111._20_4_ * 0.0;
          auVar204._24_4_ = auVar111._24_4_ * 0.0;
          auVar204._28_4_ = 0;
          auVar98 = vfmsub231ps_fma(auVar204,auVar123,auVar126);
          auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar117,ZEXT1632(auVar102));
          auVar211._0_4_ = auVar126._0_4_ * auVar144._0_4_;
          auVar211._4_4_ = auVar126._4_4_ * auVar144._4_4_;
          auVar211._8_4_ = auVar126._8_4_ * auVar144._8_4_;
          auVar211._12_4_ = auVar126._12_4_ * auVar144._12_4_;
          auVar211._16_4_ = auVar126._16_4_ * fVar177;
          auVar211._20_4_ = auVar126._20_4_ * fVar176;
          auVar211._24_4_ = auVar126._24_4_ * fVar182;
          auVar211._28_4_ = 0;
          auVar102 = vfmsub231ps_fma(auVar211,auVar112,auVar127);
          auVar113 = vfmadd231ps_avx512vl(auVar122,auVar117,ZEXT1632(auVar102));
          auVar122 = vmulps_avx512vl(auVar110,auVar145);
          auVar122 = vfmsub231ps_avx512vl(auVar122,auVar125,auVar147);
          auVar58._4_4_ = auVar124._4_4_ * auVar147._4_4_;
          auVar58._0_4_ = auVar124._0_4_ * auVar147._0_4_;
          auVar58._8_4_ = auVar124._8_4_ * auVar147._8_4_;
          auVar58._12_4_ = auVar124._12_4_ * auVar147._12_4_;
          auVar58._16_4_ = auVar124._16_4_ * fVar96;
          auVar58._20_4_ = auVar124._20_4_ * fVar97;
          auVar58._24_4_ = auVar124._24_4_ * fVar206;
          auVar58._28_4_ = iVar2;
          auVar102 = vfmsub231ps_fma(auVar58,auVar146,auVar110);
          auVar212._0_4_ = auVar146._0_4_ * auVar125._0_4_;
          auVar212._4_4_ = auVar146._4_4_ * auVar125._4_4_;
          auVar212._8_4_ = auVar146._8_4_ * auVar125._8_4_;
          auVar212._12_4_ = auVar146._12_4_ * auVar125._12_4_;
          auVar212._16_4_ = fVar188 * auVar125._16_4_;
          auVar212._20_4_ = fVar189 * auVar125._20_4_;
          auVar212._24_4_ = fVar178 * auVar125._24_4_;
          auVar212._28_4_ = 0;
          auVar98 = vfmsub231ps_fma(auVar212,auVar124,auVar145);
          auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar117,auVar122);
          auVar116 = vfmadd231ps_avx512vl(auVar122,auVar117,ZEXT1632(auVar102));
          auVar213 = ZEXT3264(auVar116);
          auVar122 = vmaxps_avx(auVar113,auVar116);
          uVar31 = vcmpps_avx512vl(auVar122,auVar117,2);
          bVar95 = bVar95 & (byte)uVar31;
          if (bVar95 != 0) {
            auVar59._4_4_ = auVar110._4_4_ * auVar126._4_4_;
            auVar59._0_4_ = auVar110._0_4_ * auVar126._0_4_;
            auVar59._8_4_ = auVar110._8_4_ * auVar126._8_4_;
            auVar59._12_4_ = auVar110._12_4_ * auVar126._12_4_;
            auVar59._16_4_ = auVar110._16_4_ * auVar126._16_4_;
            auVar59._20_4_ = auVar110._20_4_ * auVar126._20_4_;
            auVar59._24_4_ = auVar110._24_4_ * auVar126._24_4_;
            auVar59._28_4_ = auVar122._28_4_;
            auVar27 = vfmsub231ps_fma(auVar59,auVar124,auVar127);
            auVar60._4_4_ = auVar127._4_4_ * auVar125._4_4_;
            auVar60._0_4_ = auVar127._0_4_ * auVar125._0_4_;
            auVar60._8_4_ = auVar127._8_4_ * auVar125._8_4_;
            auVar60._12_4_ = auVar127._12_4_ * auVar125._12_4_;
            auVar60._16_4_ = auVar127._16_4_ * auVar125._16_4_;
            auVar60._20_4_ = auVar127._20_4_ * auVar125._20_4_;
            auVar60._24_4_ = auVar127._24_4_ * auVar125._24_4_;
            auVar60._28_4_ = auVar127._28_4_;
            auVar165 = vfmsub231ps_fma(auVar60,auVar111,auVar110);
            auVar61._4_4_ = auVar124._4_4_ * auVar111._4_4_;
            auVar61._0_4_ = auVar124._0_4_ * auVar111._0_4_;
            auVar61._8_4_ = auVar124._8_4_ * auVar111._8_4_;
            auVar61._12_4_ = auVar124._12_4_ * auVar111._12_4_;
            auVar61._16_4_ = auVar124._16_4_ * auVar111._16_4_;
            auVar61._20_4_ = auVar124._20_4_ * auVar111._20_4_;
            auVar61._24_4_ = auVar124._24_4_ * auVar111._24_4_;
            auVar61._28_4_ = auVar124._28_4_;
            auVar108 = vfmsub231ps_fma(auVar61,auVar125,auVar126);
            auVar102 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar165),ZEXT1632(auVar108));
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT1632(auVar27),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar122 = vrcp14ps_avx512vl(ZEXT1632(auVar98));
            auVar225 = ZEXT3264(auVar122);
            auVar38._8_4_ = 0x3f800000;
            auVar38._0_8_ = 0x3f8000003f800000;
            auVar38._12_4_ = 0x3f800000;
            auVar38._16_4_ = 0x3f800000;
            auVar38._20_4_ = 0x3f800000;
            auVar38._24_4_ = 0x3f800000;
            auVar38._28_4_ = 0x3f800000;
            auVar126 = vfnmadd213ps_avx512vl(auVar122,ZEXT1632(auVar98),auVar38);
            auVar102 = vfmadd132ps_fma(auVar126,auVar122,auVar122);
            auVar219 = ZEXT1664(auVar102);
            auVar62._4_4_ = auVar108._4_4_ * auVar144._4_4_;
            auVar62._0_4_ = auVar108._0_4_ * auVar144._0_4_;
            auVar62._8_4_ = auVar108._8_4_ * auVar144._8_4_;
            auVar62._12_4_ = auVar108._12_4_ * auVar144._12_4_;
            auVar62._16_4_ = fVar177 * 0.0;
            auVar62._20_4_ = fVar176 * 0.0;
            auVar62._24_4_ = fVar182 * 0.0;
            auVar62._28_4_ = iVar1;
            auVar165 = vfmadd231ps_fma(auVar62,auVar112,ZEXT1632(auVar165));
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar123,ZEXT1632(auVar27));
            fVar182 = auVar102._0_4_;
            fVar176 = auVar102._4_4_;
            fVar177 = auVar102._8_4_;
            fVar178 = auVar102._12_4_;
            local_560 = ZEXT1632(CONCAT412(auVar165._12_4_ * fVar178,
                                           CONCAT48(auVar165._8_4_ * fVar177,
                                                    CONCAT44(auVar165._4_4_ * fVar176,
                                                             auVar165._0_4_ * fVar182))));
            auVar231 = ZEXT3264(local_560);
            auVar83._4_4_ = uStack_71c;
            auVar83._0_4_ = local_720;
            auVar83._8_4_ = uStack_718;
            auVar83._12_4_ = uStack_714;
            auVar83._16_4_ = uStack_710;
            auVar83._20_4_ = uStack_70c;
            auVar83._24_4_ = uStack_708;
            auVar83._28_4_ = uStack_704;
            uVar31 = vcmpps_avx512vl(local_560,auVar83,0xd);
            uVar162 = *(undefined4 *)(ray + sVar94 * 4 + 0x200);
            auVar39._4_4_ = uVar162;
            auVar39._0_4_ = uVar162;
            auVar39._8_4_ = uVar162;
            auVar39._12_4_ = uVar162;
            auVar39._16_4_ = uVar162;
            auVar39._20_4_ = uVar162;
            auVar39._24_4_ = uVar162;
            auVar39._28_4_ = uVar162;
            uVar32 = vcmpps_avx512vl(local_560,auVar39,2);
            bVar95 = (byte)uVar31 & (byte)uVar32 & bVar95;
            if (bVar95 != 0) {
              uVar92 = vcmpps_avx512vl(ZEXT1632(auVar98),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar92 = bVar95 & uVar92;
              if ((char)uVar92 != '\0') {
                fVar189 = auVar113._0_4_ * fVar182;
                fVar188 = auVar113._4_4_ * fVar176;
                auVar63._4_4_ = fVar188;
                auVar63._0_4_ = fVar189;
                fVar206 = auVar113._8_4_ * fVar177;
                auVar63._8_4_ = fVar206;
                fVar96 = auVar113._12_4_ * fVar178;
                auVar63._12_4_ = fVar96;
                fVar97 = auVar113._16_4_ * 0.0;
                auVar63._16_4_ = fVar97;
                fVar154 = auVar113._20_4_ * 0.0;
                auVar63._20_4_ = fVar154;
                fVar155 = auVar113._24_4_ * 0.0;
                auVar63._24_4_ = fVar155;
                auVar63._28_4_ = auVar113._28_4_;
                auVar187._8_4_ = 0x3f800000;
                auVar187._0_8_ = 0x3f8000003f800000;
                auVar187._12_4_ = 0x3f800000;
                auVar187._16_4_ = 0x3f800000;
                auVar187._20_4_ = 0x3f800000;
                auVar187._24_4_ = 0x3f800000;
                auVar187._28_4_ = 0x3f800000;
                auVar122 = vsubps_avx(auVar187,auVar63);
                local_5a0._0_4_ =
                     (float)((uint)(bVar84 & 1) * (int)fVar189 |
                            (uint)!(bool)(bVar84 & 1) * auVar122._0_4_);
                bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                local_5a0._4_4_ =
                     (float)((uint)bVar13 * (int)fVar188 | (uint)!bVar13 * auVar122._4_4_);
                bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
                local_5a0._8_4_ =
                     (float)((uint)bVar13 * (int)fVar206 | (uint)!bVar13 * auVar122._8_4_);
                bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
                local_5a0._12_4_ =
                     (float)((uint)bVar13 * (int)fVar96 | (uint)!bVar13 * auVar122._12_4_);
                bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
                local_5a0._16_4_ =
                     (float)((uint)bVar13 * (int)fVar97 | (uint)!bVar13 * auVar122._16_4_);
                bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
                local_5a0._20_4_ =
                     (float)((uint)bVar13 * (int)fVar154 | (uint)!bVar13 * auVar122._20_4_);
                bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
                local_5a0._24_4_ =
                     (float)((uint)bVar13 * (int)fVar155 | (uint)!bVar13 * auVar122._24_4_);
                bVar13 = SUB81(uVar85 >> 7,0);
                local_5a0._28_4_ =
                     (float)((uint)bVar13 * auVar113._28_4_ | (uint)!bVar13 * auVar122._28_4_);
                auVar122 = vsubps_avx(auVar115,auVar114);
                auVar102 = vfmadd213ps_fma(auVar122,local_5a0,auVar114);
                uVar162 = *(undefined4 *)((long)pre->ray_space + sVar94 * 4 + -0x40);
                auVar40._4_4_ = uVar162;
                auVar40._0_4_ = uVar162;
                auVar40._8_4_ = uVar162;
                auVar40._12_4_ = uVar162;
                auVar40._16_4_ = uVar162;
                auVar40._20_4_ = uVar162;
                auVar40._24_4_ = uVar162;
                auVar40._28_4_ = uVar162;
                auVar122 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar102._12_4_ + auVar102._12_4_,
                                                              CONCAT48(auVar102._8_4_ +
                                                                       auVar102._8_4_,
                                                                       CONCAT44(auVar102._4_4_ +
                                                                                auVar102._4_4_,
                                                                                auVar102._0_4_ +
                                                                                auVar102._0_4_)))),
                                           auVar40);
                uVar33 = vcmpps_avx512vl(local_560,auVar122,6);
                uVar92 = uVar92 & uVar33;
                bVar95 = (byte)uVar92;
                if (bVar95 != 0) {
                  auVar181._0_4_ = auVar116._0_4_ * fVar182;
                  auVar181._4_4_ = auVar116._4_4_ * fVar176;
                  auVar181._8_4_ = auVar116._8_4_ * fVar177;
                  auVar181._12_4_ = auVar116._12_4_ * fVar178;
                  auVar181._16_4_ = auVar116._16_4_ * 0.0;
                  auVar181._20_4_ = auVar116._20_4_ * 0.0;
                  auVar181._24_4_ = auVar116._24_4_ * 0.0;
                  auVar181._28_4_ = 0;
                  auVar205._8_4_ = 0x3f800000;
                  auVar205._0_8_ = 0x3f8000003f800000;
                  auVar205._12_4_ = 0x3f800000;
                  auVar205._16_4_ = 0x3f800000;
                  auVar205._20_4_ = 0x3f800000;
                  auVar205._24_4_ = 0x3f800000;
                  auVar205._28_4_ = 0x3f800000;
                  auVar122 = vsubps_avx(auVar205,auVar181);
                  auVar149._0_4_ =
                       (uint)(bVar84 & 1) * (int)auVar181._0_4_ |
                       (uint)!(bool)(bVar84 & 1) * auVar122._0_4_;
                  bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                  auVar149._4_4_ =
                       (uint)bVar13 * (int)auVar181._4_4_ | (uint)!bVar13 * auVar122._4_4_;
                  bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
                  auVar149._8_4_ =
                       (uint)bVar13 * (int)auVar181._8_4_ | (uint)!bVar13 * auVar122._8_4_;
                  bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
                  auVar149._12_4_ =
                       (uint)bVar13 * (int)auVar181._12_4_ | (uint)!bVar13 * auVar122._12_4_;
                  bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
                  auVar149._16_4_ =
                       (uint)bVar13 * (int)auVar181._16_4_ | (uint)!bVar13 * auVar122._16_4_;
                  bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
                  auVar149._20_4_ =
                       (uint)bVar13 * (int)auVar181._20_4_ | (uint)!bVar13 * auVar122._20_4_;
                  bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
                  auVar149._24_4_ =
                       (uint)bVar13 * (int)auVar181._24_4_ | (uint)!bVar13 * auVar122._24_4_;
                  auVar149._28_4_ = (uint)!SUB81(uVar85 >> 7,0) * auVar122._28_4_;
                  auVar41._8_4_ = 0x40000000;
                  auVar41._0_8_ = 0x4000000040000000;
                  auVar41._12_4_ = 0x40000000;
                  auVar41._16_4_ = 0x40000000;
                  auVar41._20_4_ = 0x40000000;
                  auVar41._24_4_ = 0x40000000;
                  auVar41._28_4_ = 0x40000000;
                  local_580 = vfmsub132ps_avx512vl(auVar149,auVar205,auVar41);
                  local_540 = (undefined4)lVar89;
                  pGVar90 = (context->scene->geometries).items[uVar8].ptr;
                  if ((pGVar90->mask & *(uint *)(ray + sVar94 * 4 + 0x240)) != 0) {
                    auVar102 = vcvtsi2ss_avx512f(auVar109,local_540);
                    fVar182 = auVar102._0_4_;
                    local_4e0[0] = (fVar182 + local_5a0._0_4_ + 0.0) * local_420;
                    local_4e0[1] = (fVar182 + local_5a0._4_4_ + 1.0) * fStack_41c;
                    local_4e0[2] = (fVar182 + local_5a0._8_4_ + 2.0) * fStack_418;
                    local_4e0[3] = (fVar182 + local_5a0._12_4_ + 3.0) * fStack_414;
                    fStack_4d0 = (fVar182 + local_5a0._16_4_ + 4.0) * fStack_410;
                    fStack_4cc = (fVar182 + local_5a0._20_4_ + 5.0) * fStack_40c;
                    fStack_4c8 = (fVar182 + local_5a0._24_4_ + 6.0) * fStack_408;
                    fStack_4c4 = fVar182 + local_5a0._28_4_ + 7.0;
                    local_4c0 = local_580;
                    local_4a0 = local_560;
                    auVar171._8_4_ = 0x7f800000;
                    auVar171._0_8_ = 0x7f8000007f800000;
                    auVar171._12_4_ = 0x7f800000;
                    auVar171._16_4_ = 0x7f800000;
                    auVar171._20_4_ = 0x7f800000;
                    auVar171._24_4_ = 0x7f800000;
                    auVar171._28_4_ = 0x7f800000;
                    auVar122 = vblendmps_avx512vl(auVar171,local_560);
                    auVar150._0_4_ =
                         (uint)(bVar95 & 1) * auVar122._0_4_ |
                         (uint)!(bool)(bVar95 & 1) * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
                    auVar150._4_4_ = (uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
                    auVar150._8_4_ = (uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
                    auVar150._12_4_ = (uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar92 >> 4) & 1);
                    auVar150._16_4_ = (uint)bVar13 * auVar122._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar92 >> 5) & 1);
                    auVar150._20_4_ = (uint)bVar13 * auVar122._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar92 >> 6) & 1);
                    auVar150._24_4_ = (uint)bVar13 * auVar122._24_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = SUB81(uVar92 >> 7,0);
                    auVar150._28_4_ = (uint)bVar13 * auVar122._28_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar122 = vshufps_avx(auVar150,auVar150,0xb1);
                    auVar122 = vminps_avx(auVar150,auVar122);
                    auVar126 = vshufpd_avx(auVar122,auVar122,5);
                    auVar122 = vminps_avx(auVar122,auVar126);
                    auVar126 = vpermpd_avx2(auVar122,0x4e);
                    auVar122 = vminps_avx(auVar122,auVar126);
                    uVar31 = vcmpps_avx512vl(auVar150,auVar122,0);
                    uVar86 = (uint)uVar92;
                    if ((bVar95 & (byte)uVar31) != 0) {
                      uVar86 = (uint)(bVar95 & (byte)uVar31);
                    }
                    uVar87 = 0;
                    for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
                      uVar87 = uVar87 + 1;
                    }
                    uVar85 = (ulong)uVar87;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar90->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_440 = vmovdqa64_avx512vl(auVar175._0_32_);
                      local_810 = ZEXT416(*(uint *)(ray + sVar94 * 4 + 0x200));
                      local_7c0._0_8_ = pGVar90;
                      local_7e8 = lVar88;
                      local_7a0 = local_560;
                      local_53c = iVar10;
                      local_530 = auVar103;
                      local_520 = uVar30;
                      uStack_518 = uVar34;
                      local_510 = uVar77;
                      uStack_508 = uVar78;
                      local_500 = uVar79;
                      uStack_4f8 = uVar80;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_4e0[uVar85]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_4c0 + uVar85 * 4)))
                        ;
                        *(undefined4 *)(ray + sVar94 * 4 + 0x200) =
                             *(undefined4 *)(local_4a0 + uVar85 * 4);
                        local_840.context = context->user;
                        fVar176 = local_200._0_4_;
                        fVar182 = 1.0 - fVar176;
                        auVar27 = vfnmadd231ss_fma(ZEXT416((uint)(fVar176 * (fVar182 + fVar182))),
                                                   ZEXT416((uint)fVar182),ZEXT416((uint)fVar182));
                        auVar165 = local_200._0_16_;
                        auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar165,
                                                   ZEXT416(0xc0a00000));
                        auVar98 = vfmadd231ss_fma(ZEXT416((uint)(fVar176 * fVar176 * 3.0)),
                                                  ZEXT416((uint)(fVar176 + fVar176)),auVar102);
                        auVar225 = ZEXT1664(auVar98);
                        auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar165,
                                                   ZEXT416(0x40000000));
                        auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar182 * fVar182 * -3.0)),
                                                   ZEXT416((uint)(fVar182 + fVar182)),auVar102);
                        auVar165 = vfmadd231ss_fma(ZEXT416((uint)(fVar176 * fVar176)),auVar165,
                                                   ZEXT416((uint)(fVar182 * -2.0)));
                        fVar182 = auVar27._0_4_ * 0.5;
                        fVar176 = auVar98._0_4_ * 0.5;
                        fVar177 = auVar102._0_4_ * 0.5;
                        fVar178 = auVar165._0_4_ * 0.5;
                        auVar199._0_4_ = fVar178 * local_8a0;
                        auVar199._4_4_ = fVar178 * fStack_89c;
                        auVar199._8_4_ = fVar178 * fStack_898;
                        auVar199._12_4_ = fVar178 * fStack_894;
                        auVar217._4_4_ = fVar177;
                        auVar217._0_4_ = fVar177;
                        auVar217._8_4_ = fVar177;
                        auVar217._12_4_ = fVar177;
                        auVar102 = vfmadd132ps_fma(auVar217,auVar199,auVar29);
                        auVar200._4_4_ = fVar176;
                        auVar200._0_4_ = fVar176;
                        auVar200._8_4_ = fVar176;
                        auVar200._12_4_ = fVar176;
                        auVar102 = vfmadd132ps_fma(auVar200,auVar102,auVar100);
                        auVar166._4_4_ = fVar182;
                        auVar166._0_4_ = fVar182;
                        auVar166._8_4_ = fVar182;
                        auVar166._12_4_ = fVar182;
                        auVar102 = vfmadd213ps_fma(auVar166,auVar103,auVar102);
                        auVar175 = vbroadcastss_avx512f(auVar102);
                        auVar213 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar213 = vpermps_avx512f(auVar213,ZEXT1664(auVar102));
                        auVar219 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar219,ZEXT1664(auVar102));
                        local_2c0[0] = (RTCHitN)auVar175[0];
                        local_2c0[1] = (RTCHitN)auVar175[1];
                        local_2c0[2] = (RTCHitN)auVar175[2];
                        local_2c0[3] = (RTCHitN)auVar175[3];
                        local_2c0[4] = (RTCHitN)auVar175[4];
                        local_2c0[5] = (RTCHitN)auVar175[5];
                        local_2c0[6] = (RTCHitN)auVar175[6];
                        local_2c0[7] = (RTCHitN)auVar175[7];
                        local_2c0[8] = (RTCHitN)auVar175[8];
                        local_2c0[9] = (RTCHitN)auVar175[9];
                        local_2c0[10] = (RTCHitN)auVar175[10];
                        local_2c0[0xb] = (RTCHitN)auVar175[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar175[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar175[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar175[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar175[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar175[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar175[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar175[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar175[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar175[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar175[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar175[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar175[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar175[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar175[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar175[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar175[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar175[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar175[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar175[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar175[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar175[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar175[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar175[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar175[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar175[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar175[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar175[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar175[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar175[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar175[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar175[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar175[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar175[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar175[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar175[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar175[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar175[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar175[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar175[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar175[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar175[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar175[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar175[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar175[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar175[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar175[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar175[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar175[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar175[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar175[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar175[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar175[0x3f];
                        local_280 = auVar213;
                        local_180 = local_340._0_8_;
                        uStack_178 = local_340._8_8_;
                        uStack_170 = local_340._16_8_;
                        uStack_168 = local_340._24_8_;
                        uStack_160 = local_340._32_8_;
                        uStack_158 = local_340._40_8_;
                        uStack_150 = local_340._48_8_;
                        uStack_148 = local_340._56_8_;
                        auVar175 = vmovdqa64_avx512f(local_300);
                        local_140 = vmovdqa64_avx512f(auVar175);
                        auVar122 = vpcmpeqd_avx2(auVar175._0_32_,auVar175._0_32_);
                        local_7f0[3] = auVar122;
                        local_7f0[2] = auVar122;
                        local_7f0[1] = auVar122;
                        *local_7f0 = auVar122;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instPrimID[0]))
                        ;
                        auVar175 = vmovdqa64_avx512f(local_380);
                        local_700 = vmovdqa64_avx512f(auVar175);
                        local_840.valid = (int *)local_700;
                        local_840.geometryUserPtr = pGVar90->userPtr;
                        local_840.hit = local_2c0;
                        local_840.N = 0x10;
                        local_840.ray = (RTCRayN *)ray;
                        if (pGVar90->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar213 = ZEXT1664(auVar213._0_16_);
                          auVar219 = ZEXT1664(auVar219._0_16_);
                          auVar225 = ZEXT1664(auVar98);
                          (*pGVar90->intersectionFilterN)(&local_840);
                          auVar231 = ZEXT3264(local_7a0);
                          auVar175 = vmovdqa64_avx512f(local_700);
                          pGVar90 = (Geometry *)local_7c0._0_8_;
                        }
                        uVar31 = vptestmd_avx512f(auVar175,auVar175);
                        if ((short)uVar31 == 0) {
LAB_0180af15:
                          *(undefined4 *)(ray + sVar94 * 4 + 0x200) = local_810._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar90->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar213 = ZEXT1664(auVar213._0_16_);
                            auVar219 = ZEXT1664(auVar219._0_16_);
                            auVar225 = ZEXT1664(auVar225._0_16_);
                            (*p_Var12)(&local_840);
                            auVar231 = ZEXT3264(local_7a0);
                            auVar175 = vmovdqa64_avx512f(local_700);
                            pGVar90 = (Geometry *)local_7c0._0_8_;
                          }
                          uVar33 = vptestmd_avx512f(auVar175,auVar175);
                          if ((short)uVar33 == 0) goto LAB_0180af15;
                          iVar1 = *(int *)(local_840.hit + 4);
                          iVar2 = *(int *)(local_840.hit + 8);
                          iVar64 = *(int *)(local_840.hit + 0xc);
                          iVar65 = *(int *)(local_840.hit + 0x10);
                          iVar66 = *(int *)(local_840.hit + 0x14);
                          iVar67 = *(int *)(local_840.hit + 0x18);
                          iVar68 = *(int *)(local_840.hit + 0x1c);
                          iVar69 = *(int *)(local_840.hit + 0x20);
                          iVar70 = *(int *)(local_840.hit + 0x24);
                          iVar71 = *(int *)(local_840.hit + 0x28);
                          iVar72 = *(int *)(local_840.hit + 0x2c);
                          iVar73 = *(int *)(local_840.hit + 0x30);
                          iVar74 = *(int *)(local_840.hit + 0x34);
                          iVar75 = *(int *)(local_840.hit + 0x38);
                          iVar76 = *(int *)(local_840.hit + 0x3c);
                          bVar95 = (byte)uVar33;
                          bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar33 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar33 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar33 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar33 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar33 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar33 >> 7) & 1);
                          bVar84 = (byte)(uVar33 >> 8);
                          bVar20 = (bool)((byte)(uVar33 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar33 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar33 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar33 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar33 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar33 >> 0xe) & 1);
                          bVar26 = SUB81(uVar33 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x300) =
                               (uint)(bVar95 & 1) * *(int *)local_840.hit |
                               (uint)!(bool)(bVar95 & 1) * *(int *)(local_840.ray + 0x300);
                          *(uint *)(local_840.ray + 0x304) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_840.ray + 0x304);
                          *(uint *)(local_840.ray + 0x308) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_840.ray + 0x308);
                          *(uint *)(local_840.ray + 0x30c) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_840.ray + 0x30c);
                          *(uint *)(local_840.ray + 0x310) =
                               (uint)bVar16 * iVar65 |
                               (uint)!bVar16 * *(int *)(local_840.ray + 0x310);
                          *(uint *)(local_840.ray + 0x314) =
                               (uint)bVar17 * iVar66 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x314);
                          *(uint *)(local_840.ray + 0x318) =
                               (uint)bVar18 * iVar67 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x318);
                          *(uint *)(local_840.ray + 0x31c) =
                               (uint)bVar19 * iVar68 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x31c);
                          *(uint *)(local_840.ray + 800) =
                               (uint)(bVar84 & 1) * iVar69 |
                               (uint)!(bool)(bVar84 & 1) * *(int *)(local_840.ray + 800);
                          *(uint *)(local_840.ray + 0x324) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x324);
                          *(uint *)(local_840.ray + 0x328) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x328);
                          *(uint *)(local_840.ray + 0x32c) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x32c);
                          *(uint *)(local_840.ray + 0x330) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x330);
                          *(uint *)(local_840.ray + 0x334) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x334);
                          *(uint *)(local_840.ray + 0x338) =
                               (uint)bVar25 * iVar75 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x338);
                          *(uint *)(local_840.ray + 0x33c) =
                               (uint)bVar26 * iVar76 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x33c);
                          iVar1 = *(int *)(local_840.hit + 0x44);
                          iVar2 = *(int *)(local_840.hit + 0x48);
                          iVar64 = *(int *)(local_840.hit + 0x4c);
                          iVar65 = *(int *)(local_840.hit + 0x50);
                          iVar66 = *(int *)(local_840.hit + 0x54);
                          iVar67 = *(int *)(local_840.hit + 0x58);
                          iVar68 = *(int *)(local_840.hit + 0x5c);
                          iVar69 = *(int *)(local_840.hit + 0x60);
                          iVar70 = *(int *)(local_840.hit + 100);
                          iVar71 = *(int *)(local_840.hit + 0x68);
                          iVar72 = *(int *)(local_840.hit + 0x6c);
                          iVar73 = *(int *)(local_840.hit + 0x70);
                          iVar74 = *(int *)(local_840.hit + 0x74);
                          iVar75 = *(int *)(local_840.hit + 0x78);
                          iVar76 = *(int *)(local_840.hit + 0x7c);
                          bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar33 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar33 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar33 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar33 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar33 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar33 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar33 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar33 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar33 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar33 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar33 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar33 >> 0xe) & 1);
                          bVar26 = SUB81(uVar33 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x340) =
                               (uint)(bVar95 & 1) * *(int *)(local_840.hit + 0x40) |
                               (uint)!(bool)(bVar95 & 1) * *(int *)(local_840.ray + 0x340);
                          *(uint *)(local_840.ray + 0x344) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_840.ray + 0x344);
                          *(uint *)(local_840.ray + 0x348) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_840.ray + 0x348);
                          *(uint *)(local_840.ray + 0x34c) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_840.ray + 0x34c);
                          *(uint *)(local_840.ray + 0x350) =
                               (uint)bVar16 * iVar65 |
                               (uint)!bVar16 * *(int *)(local_840.ray + 0x350);
                          *(uint *)(local_840.ray + 0x354) =
                               (uint)bVar17 * iVar66 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x354);
                          *(uint *)(local_840.ray + 0x358) =
                               (uint)bVar18 * iVar67 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x358);
                          *(uint *)(local_840.ray + 0x35c) =
                               (uint)bVar19 * iVar68 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x35c);
                          *(uint *)(local_840.ray + 0x360) =
                               (uint)(bVar84 & 1) * iVar69 |
                               (uint)!(bool)(bVar84 & 1) * *(int *)(local_840.ray + 0x360);
                          *(uint *)(local_840.ray + 0x364) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x364);
                          *(uint *)(local_840.ray + 0x368) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x368);
                          *(uint *)(local_840.ray + 0x36c) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x36c);
                          *(uint *)(local_840.ray + 0x370) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x370);
                          *(uint *)(local_840.ray + 0x374) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x374);
                          *(uint *)(local_840.ray + 0x378) =
                               (uint)bVar25 * iVar75 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x378);
                          *(uint *)(local_840.ray + 0x37c) =
                               (uint)bVar26 * iVar76 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x37c);
                          iVar1 = *(int *)(local_840.hit + 0x84);
                          iVar2 = *(int *)(local_840.hit + 0x88);
                          iVar64 = *(int *)(local_840.hit + 0x8c);
                          iVar65 = *(int *)(local_840.hit + 0x90);
                          iVar66 = *(int *)(local_840.hit + 0x94);
                          iVar67 = *(int *)(local_840.hit + 0x98);
                          iVar68 = *(int *)(local_840.hit + 0x9c);
                          iVar69 = *(int *)(local_840.hit + 0xa0);
                          iVar70 = *(int *)(local_840.hit + 0xa4);
                          iVar71 = *(int *)(local_840.hit + 0xa8);
                          iVar72 = *(int *)(local_840.hit + 0xac);
                          iVar73 = *(int *)(local_840.hit + 0xb0);
                          iVar74 = *(int *)(local_840.hit + 0xb4);
                          iVar75 = *(int *)(local_840.hit + 0xb8);
                          iVar76 = *(int *)(local_840.hit + 0xbc);
                          bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar33 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar33 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar33 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar33 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar33 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar33 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar33 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar33 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar33 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar33 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar33 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar33 >> 0xe) & 1);
                          bVar26 = SUB81(uVar33 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x380) =
                               (uint)(bVar95 & 1) * *(int *)(local_840.hit + 0x80) |
                               (uint)!(bool)(bVar95 & 1) * *(int *)(local_840.ray + 0x380);
                          *(uint *)(local_840.ray + 900) =
                               (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_840.ray + 900);
                          *(uint *)(local_840.ray + 0x388) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_840.ray + 0x388);
                          *(uint *)(local_840.ray + 0x38c) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_840.ray + 0x38c);
                          *(uint *)(local_840.ray + 0x390) =
                               (uint)bVar16 * iVar65 |
                               (uint)!bVar16 * *(int *)(local_840.ray + 0x390);
                          *(uint *)(local_840.ray + 0x394) =
                               (uint)bVar17 * iVar66 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x394);
                          *(uint *)(local_840.ray + 0x398) =
                               (uint)bVar18 * iVar67 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x398);
                          *(uint *)(local_840.ray + 0x39c) =
                               (uint)bVar19 * iVar68 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x39c);
                          *(uint *)(local_840.ray + 0x3a0) =
                               (uint)(bVar84 & 1) * iVar69 |
                               (uint)!(bool)(bVar84 & 1) * *(int *)(local_840.ray + 0x3a0);
                          *(uint *)(local_840.ray + 0x3a4) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x3a4);
                          *(uint *)(local_840.ray + 0x3a8) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x3a8);
                          *(uint *)(local_840.ray + 0x3ac) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x3ac);
                          *(uint *)(local_840.ray + 0x3b0) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x3b0);
                          *(uint *)(local_840.ray + 0x3b4) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x3b4);
                          *(uint *)(local_840.ray + 0x3b8) =
                               (uint)bVar25 * iVar75 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x3b8);
                          *(uint *)(local_840.ray + 0x3bc) =
                               (uint)bVar26 * iVar76 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x3bc);
                          iVar1 = *(int *)(local_840.hit + 0xc4);
                          iVar2 = *(int *)(local_840.hit + 200);
                          iVar64 = *(int *)(local_840.hit + 0xcc);
                          iVar65 = *(int *)(local_840.hit + 0xd0);
                          iVar66 = *(int *)(local_840.hit + 0xd4);
                          iVar67 = *(int *)(local_840.hit + 0xd8);
                          iVar68 = *(int *)(local_840.hit + 0xdc);
                          iVar69 = *(int *)(local_840.hit + 0xe0);
                          iVar70 = *(int *)(local_840.hit + 0xe4);
                          iVar71 = *(int *)(local_840.hit + 0xe8);
                          iVar72 = *(int *)(local_840.hit + 0xec);
                          iVar73 = *(int *)(local_840.hit + 0xf0);
                          iVar74 = *(int *)(local_840.hit + 0xf4);
                          iVar75 = *(int *)(local_840.hit + 0xf8);
                          iVar76 = *(int *)(local_840.hit + 0xfc);
                          bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar33 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar33 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar33 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar33 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar33 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar33 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar33 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar33 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar33 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar33 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar33 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar33 >> 0xe) & 1);
                          bVar26 = SUB81(uVar33 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x3c0) =
                               (uint)(bVar95 & 1) * *(int *)(local_840.hit + 0xc0) |
                               (uint)!(bool)(bVar95 & 1) * *(int *)(local_840.ray + 0x3c0);
                          *(uint *)(local_840.ray + 0x3c4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_840.ray + 0x3c4);
                          *(uint *)(local_840.ray + 0x3c8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_840.ray + 0x3c8);
                          *(uint *)(local_840.ray + 0x3cc) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_840.ray + 0x3cc);
                          *(uint *)(local_840.ray + 0x3d0) =
                               (uint)bVar16 * iVar65 |
                               (uint)!bVar16 * *(int *)(local_840.ray + 0x3d0);
                          *(uint *)(local_840.ray + 0x3d4) =
                               (uint)bVar17 * iVar66 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x3d4);
                          *(uint *)(local_840.ray + 0x3d8) =
                               (uint)bVar18 * iVar67 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x3d8);
                          *(uint *)(local_840.ray + 0x3dc) =
                               (uint)bVar19 * iVar68 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x3dc);
                          *(uint *)(local_840.ray + 0x3e0) =
                               (uint)(bVar84 & 1) * iVar69 |
                               (uint)!(bool)(bVar84 & 1) * *(int *)(local_840.ray + 0x3e0);
                          *(uint *)(local_840.ray + 0x3e4) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x3e4);
                          *(uint *)(local_840.ray + 1000) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 1000);
                          *(uint *)(local_840.ray + 0x3ec) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x3ec);
                          *(uint *)(local_840.ray + 0x3f0) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x3f0);
                          *(uint *)(local_840.ray + 0x3f4) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x3f4);
                          *(uint *)(local_840.ray + 0x3f8) =
                               (uint)bVar25 * iVar75 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x3f8);
                          *(uint *)(local_840.ray + 0x3fc) =
                               (uint)bVar26 * iVar76 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x3fc);
                          iVar1 = *(int *)(local_840.hit + 0x104);
                          iVar2 = *(int *)(local_840.hit + 0x108);
                          iVar64 = *(int *)(local_840.hit + 0x10c);
                          iVar65 = *(int *)(local_840.hit + 0x110);
                          iVar66 = *(int *)(local_840.hit + 0x114);
                          iVar67 = *(int *)(local_840.hit + 0x118);
                          iVar68 = *(int *)(local_840.hit + 0x11c);
                          iVar69 = *(int *)(local_840.hit + 0x120);
                          iVar70 = *(int *)(local_840.hit + 0x124);
                          iVar71 = *(int *)(local_840.hit + 0x128);
                          iVar72 = *(int *)(local_840.hit + 300);
                          iVar73 = *(int *)(local_840.hit + 0x130);
                          iVar74 = *(int *)(local_840.hit + 0x134);
                          iVar75 = *(int *)(local_840.hit + 0x138);
                          iVar76 = *(int *)(local_840.hit + 0x13c);
                          bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar33 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar33 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar33 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar33 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar33 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar33 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar33 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar33 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar33 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar33 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar33 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar33 >> 0xe) & 1);
                          bVar26 = SUB81(uVar33 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x400) =
                               (uint)(bVar95 & 1) * *(int *)(local_840.hit + 0x100) |
                               (uint)!(bool)(bVar95 & 1) * *(int *)(local_840.ray + 0x400);
                          *(uint *)(local_840.ray + 0x404) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_840.ray + 0x404);
                          *(uint *)(local_840.ray + 0x408) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_840.ray + 0x408);
                          *(uint *)(local_840.ray + 0x40c) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_840.ray + 0x40c);
                          *(uint *)(local_840.ray + 0x410) =
                               (uint)bVar16 * iVar65 |
                               (uint)!bVar16 * *(int *)(local_840.ray + 0x410);
                          *(uint *)(local_840.ray + 0x414) =
                               (uint)bVar17 * iVar66 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x414);
                          *(uint *)(local_840.ray + 0x418) =
                               (uint)bVar18 * iVar67 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x418);
                          *(uint *)(local_840.ray + 0x41c) =
                               (uint)bVar19 * iVar68 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x41c);
                          *(uint *)(local_840.ray + 0x420) =
                               (uint)(bVar84 & 1) * iVar69 |
                               (uint)!(bool)(bVar84 & 1) * *(int *)(local_840.ray + 0x420);
                          *(uint *)(local_840.ray + 0x424) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x424);
                          *(uint *)(local_840.ray + 0x428) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x428);
                          *(uint *)(local_840.ray + 0x42c) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x42c);
                          *(uint *)(local_840.ray + 0x430) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x430);
                          *(uint *)(local_840.ray + 0x434) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x434);
                          *(uint *)(local_840.ray + 0x438) =
                               (uint)bVar25 * iVar75 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x438);
                          *(uint *)(local_840.ray + 0x43c) =
                               (uint)bVar26 * iVar76 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x43c);
                          auVar175 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x140)
                                                      );
                          auVar175 = vmovdqu32_avx512f(auVar175);
                          *(undefined1 (*) [64])(local_840.ray + 0x440) = auVar175;
                          auVar175 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x180)
                                                      );
                          auVar175 = vmovdqu32_avx512f(auVar175);
                          *(undefined1 (*) [64])(local_840.ray + 0x480) = auVar175;
                          auVar175 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x1c0)
                                                      );
                          auVar175 = vmovdqa32_avx512f(auVar175);
                          *(undefined1 (*) [64])(local_840.ray + 0x4c0) = auVar175;
                          auVar175 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x200)
                                                      );
                          auVar175 = vmovdqa32_avx512f(auVar175);
                          *(undefined1 (*) [64])(local_840.ray + 0x500) = auVar175;
                          local_810._0_4_ = *(undefined4 *)(ray + sVar94 * 4 + 0x200);
                          local_810._4_4_ = 0;
                          local_810._8_4_ = 0;
                          local_810._12_4_ = 0;
                        }
                        bVar95 = ~(byte)(1 << ((uint)uVar85 & 0x1f)) & (byte)uVar92;
                        auVar172._4_4_ = local_810._0_4_;
                        auVar172._0_4_ = local_810._0_4_;
                        auVar172._8_4_ = local_810._0_4_;
                        auVar172._12_4_ = local_810._0_4_;
                        auVar172._16_4_ = local_810._0_4_;
                        auVar172._20_4_ = local_810._0_4_;
                        auVar172._24_4_ = local_810._0_4_;
                        auVar172._28_4_ = local_810._0_4_;
                        uVar31 = vcmpps_avx512vl(auVar231._0_32_,auVar172,2);
                        if ((bVar95 & (byte)uVar31) == 0) goto LAB_0180afb5;
                        bVar95 = bVar95 & (byte)uVar31;
                        uVar92 = (ulong)bVar95;
                        auVar173._8_4_ = 0x7f800000;
                        auVar173._0_8_ = 0x7f8000007f800000;
                        auVar173._12_4_ = 0x7f800000;
                        auVar173._16_4_ = 0x7f800000;
                        auVar173._20_4_ = 0x7f800000;
                        auVar173._24_4_ = 0x7f800000;
                        auVar173._28_4_ = 0x7f800000;
                        auVar122 = vblendmps_avx512vl(auVar173,auVar231._0_32_);
                        auVar151._0_4_ =
                             (uint)(bVar95 & 1) * auVar122._0_4_ |
                             (uint)!(bool)(bVar95 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar95 >> 1 & 1);
                        auVar151._4_4_ = (uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar95 >> 2 & 1);
                        auVar151._8_4_ = (uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar95 >> 3 & 1);
                        auVar151._12_4_ =
                             (uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar95 >> 4 & 1);
                        auVar151._16_4_ =
                             (uint)bVar13 * auVar122._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar95 >> 5 & 1);
                        auVar151._20_4_ =
                             (uint)bVar13 * auVar122._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar95 >> 6 & 1);
                        auVar151._24_4_ =
                             (uint)bVar13 * auVar122._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar151._28_4_ =
                             (uint)(bVar95 >> 7) * auVar122._28_4_ |
                             (uint)!(bool)(bVar95 >> 7) * 0x7f800000;
                        auVar122 = vshufps_avx(auVar151,auVar151,0xb1);
                        auVar122 = vminps_avx(auVar151,auVar122);
                        auVar126 = vshufpd_avx(auVar122,auVar122,5);
                        auVar122 = vminps_avx(auVar122,auVar126);
                        auVar126 = vpermpd_avx2(auVar122,0x4e);
                        auVar122 = vminps_avx(auVar122,auVar126);
                        uVar31 = vcmpps_avx512vl(auVar151,auVar122,0);
                        bVar84 = (byte)uVar31 & bVar95;
                        if (bVar84 != 0) {
                          bVar95 = bVar84;
                        }
                        uVar86 = 0;
                        for (uVar87 = (uint)bVar95; (uVar87 & 1) == 0;
                            uVar87 = uVar87 >> 1 | 0x80000000) {
                          uVar86 = uVar86 + 1;
                        }
                        uVar85 = (ulong)uVar86;
                      } while( true );
                    }
                    fVar182 = local_4e0[uVar85];
                    uVar162 = *(undefined4 *)(local_4c0 + uVar85 * 4);
                    fVar176 = 1.0 - fVar182;
                    auVar27 = vfnmadd231ss_fma(ZEXT416((uint)(fVar182 * (fVar176 + fVar176))),
                                               ZEXT416((uint)fVar176),ZEXT416((uint)fVar176));
                    auVar165 = ZEXT416((uint)fVar182);
                    auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar165,
                                               ZEXT416(0xc0a00000));
                    auVar98 = vfmadd231ss_fma(ZEXT416((uint)(fVar182 * fVar182 * 3.0)),
                                              ZEXT416((uint)(fVar182 + fVar182)),auVar102);
                    auVar225 = ZEXT1664(auVar98);
                    auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar165,
                                               ZEXT416(0x40000000));
                    auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar176 * fVar176 * -3.0)),
                                               ZEXT416((uint)(fVar176 + fVar176)),auVar102);
                    auVar165 = vfmadd231ss_fma(ZEXT416((uint)(fVar182 * fVar182)),auVar165,
                                               ZEXT416((uint)(fVar176 * -2.0)));
                    fVar176 = auVar27._0_4_ * 0.5;
                    fVar177 = auVar98._0_4_ * 0.5;
                    auVar213 = ZEXT464((uint)fVar177);
                    fVar178 = auVar102._0_4_ * 0.5;
                    fVar189 = auVar165._0_4_ * 0.5;
                    auVar197._0_4_ = fVar189 * local_8a0;
                    auVar197._4_4_ = fVar189 * fStack_89c;
                    auVar197._8_4_ = fVar189 * fStack_898;
                    auVar197._12_4_ = fVar189 * fStack_894;
                    auVar216._4_4_ = fVar178;
                    auVar216._0_4_ = fVar178;
                    auVar216._8_4_ = fVar178;
                    auVar216._12_4_ = fVar178;
                    auVar102 = vfmadd132ps_fma(auVar216,auVar197,auVar99);
                    auVar219 = ZEXT1664(auVar102);
                    auVar198._4_4_ = fVar177;
                    auVar198._0_4_ = fVar177;
                    auVar198._8_4_ = fVar177;
                    auVar198._12_4_ = fVar177;
                    auVar102 = vfmadd132ps_fma(auVar198,auVar102,auVar28);
                    auVar185._4_4_ = fVar176;
                    auVar185._0_4_ = fVar176;
                    auVar185._8_4_ = fVar176;
                    auVar185._12_4_ = fVar176;
                    auVar102 = vfmadd213ps_fma(auVar185,auVar103,auVar102);
                    *(undefined4 *)(ray + sVar94 * 4 + 0x200) =
                         *(undefined4 *)(local_4a0 + uVar85 * 4);
                    *(int *)(ray + sVar94 * 4 + 0x300) = auVar102._0_4_;
                    uVar11 = vextractps_avx(auVar102,1);
                    *(undefined4 *)(ray + sVar94 * 4 + 0x340) = uVar11;
                    uVar11 = vextractps_avx(auVar102,2);
                    *(undefined4 *)(ray + sVar94 * 4 + 0x380) = uVar11;
                    *(float *)(ray + sVar94 * 4 + 0x3c0) = fVar182;
                    *(undefined4 *)(ray + sVar94 * 4 + 0x400) = uVar162;
                    *(uint *)(ray + sVar94 * 4 + 0x440) = uVar9;
                    *(uint *)(ray + sVar94 * 4 + 0x480) = uVar8;
                    *(uint *)(ray + sVar94 * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + sVar94 * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_0180ab85;
      }
    }
    uVar162 = *(undefined4 *)(ray + sVar94 * 4 + 0x200);
    auVar35._4_4_ = uVar162;
    auVar35._0_4_ = uVar162;
    auVar35._8_4_ = uVar162;
    auVar35._12_4_ = uVar162;
    uVar30 = vcmpps_avx512vl(local_470,auVar35,2);
    uVar91 = (ulong)((uint)uVar91 & (uint)uVar30);
  } while( true );
LAB_0180afb5:
  auVar238 = ZEXT3264(local_760);
  auVar239 = ZEXT3264(local_780);
  auVar122 = vmovdqa64_avx512vl(local_440);
  auVar175 = ZEXT3264(auVar122);
  lVar88 = local_7e8;
LAB_0180ab85:
  lVar89 = lVar89 + 8;
  goto LAB_0180a289;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }